

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse2::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse2::SubGridMBIntersectorKPluecker<4,_4,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  undefined4 uVar15;
  int iVar16;
  ulong uVar17;
  Geometry *pGVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  byte bVar28;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  undefined1 auVar32 [15];
  undefined1 auVar33 [14];
  undefined1 auVar34 [15];
  undefined1 auVar35 [14];
  undefined1 auVar36 [15];
  undefined1 auVar37 [14];
  undefined1 auVar38 [15];
  undefined1 auVar39 [14];
  undefined1 auVar40 [15];
  undefined1 auVar41 [14];
  undefined1 auVar42 [15];
  undefined1 auVar43 [14];
  undefined1 auVar44 [14];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [14];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [14];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [13];
  undefined1 auVar78 [13];
  undefined1 auVar79 [13];
  undefined1 auVar80 [13];
  undefined1 auVar81 [13];
  undefined1 auVar82 [13];
  undefined1 auVar83 [15];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [16];
  undefined1 auVar90 [15];
  unkuint9 Var91;
  undefined1 auVar92 [11];
  undefined1 auVar93 [13];
  undefined1 auVar94 [14];
  undefined1 auVar95 [15];
  undefined1 auVar96 [11];
  undefined1 auVar97 [13];
  undefined1 auVar98 [14];
  undefined1 auVar99 [15];
  undefined1 auVar100 [11];
  undefined1 auVar101 [13];
  undefined1 auVar102 [14];
  undefined1 auVar103 [15];
  undefined1 auVar104 [11];
  undefined1 auVar105 [13];
  undefined1 auVar106 [14];
  undefined1 auVar107 [15];
  undefined1 auVar108 [11];
  undefined1 auVar109 [13];
  undefined1 auVar110 [14];
  undefined1 auVar111 [15];
  undefined1 auVar112 [11];
  undefined1 auVar113 [13];
  undefined1 auVar114 [14];
  undefined1 auVar115 [14];
  undefined1 auVar116 [12];
  unkbyte10 Var117;
  undefined1 auVar118 [14];
  undefined1 auVar119 [15];
  undefined1 auVar120 [15];
  undefined1 auVar121 [15];
  undefined1 auVar122 [15];
  undefined1 auVar123 [15];
  undefined1 auVar124 [15];
  undefined1 auVar125 [15];
  undefined1 auVar126 [15];
  undefined1 auVar127 [15];
  undefined1 auVar128 [15];
  undefined1 auVar129 [15];
  undefined1 auVar130 [15];
  uint6 uVar131;
  uint6 uVar132;
  uint6 uVar133;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar134;
  int iVar135;
  AABBNodeMB4D *node1;
  long lVar136;
  ulong uVar137;
  long lVar138;
  RTCRayN *pRVar139;
  RTCFilterFunctionN p_Var140;
  uint uVar141;
  long lVar142;
  undefined4 uVar143;
  undefined4 uVar146;
  long lVar145;
  long lVar147;
  ulong uVar148;
  ulong uVar149;
  ulong uVar150;
  ulong uVar151;
  long lVar152;
  ulong uVar153;
  long lVar154;
  ulong uVar155;
  uint uVar156;
  uint uVar157;
  uint uVar158;
  uint uVar159;
  uint uVar160;
  uint uVar161;
  uint uVar162;
  uint uVar163;
  uint uVar164;
  uint uVar165;
  uint uVar166;
  uint uVar167;
  float fVar168;
  float fVar169;
  float extraout_XMM0_Dc;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float extraout_XMM0_Dd;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar180;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar183;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar189;
  ushort uVar190;
  float fVar214;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar215;
  float fVar216;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar207;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar217;
  float fVar239;
  float fVar240;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar258;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar259;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  ushort uVar260;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  ushort uVar268;
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  float fVar287;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  float fVar288;
  float fVar289;
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  undefined1 auVar290 [16];
  float fVar298;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  float fVar299;
  float fVar300;
  float fVar305;
  float fVar306;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar330;
  float fVar331;
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  byte bVar332;
  char cVar333;
  byte bVar341;
  byte bVar343;
  float fVar334;
  float fVar335;
  char cVar342;
  char cVar344;
  byte bVar345;
  char cVar346;
  char cVar347;
  char cVar348;
  float fVar349;
  char cVar350;
  char cVar351;
  char cVar352;
  char cVar353;
  char cVar355;
  char cVar356;
  float fVar357;
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  float fVar358;
  float fVar359;
  float fVar360;
  float fVar361;
  float fVar362;
  float fVar363;
  float fVar364;
  float fVar365;
  float fVar366;
  float fVar367;
  float fVar368;
  float fVar369;
  float fVar370;
  float fVar371;
  float fVar372;
  float fVar373;
  UVIdentity<4> mapUV;
  undefined1 local_14d8 [8];
  float fStack_14d0;
  float fStack_14cc;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined4 uStack_149c;
  undefined1 local_1498 [8];
  undefined8 uStack_1490;
  float local_1468;
  float fStack_1464;
  float fStack_144c;
  undefined8 local_1448;
  undefined8 uStack_1440;
  vbool<4> valid;
  undefined1 local_1428 [16];
  ulong local_1410;
  RTCFilterFunctionNArguments args;
  float local_1388;
  float fStack_1384;
  float fStack_1380;
  float fStack_137c;
  float local_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  vint<4> sy;
  vfloat<4> tNear;
  undefined1 local_1308 [16];
  undefined1 local_12f8 [16];
  undefined1 local_12e8 [8];
  float fStack_12e0;
  float fStack_12dc;
  float local_12d8 [4];
  undefined1 local_12c8 [8];
  float fStack_12c0;
  float fStack_12bc;
  float local_12b8 [4];
  undefined1 local_12a8 [16];
  undefined1 local_1298 [16];
  float local_1288;
  float fStack_1284;
  float fStack_1280;
  float fStack_127c;
  undefined8 local_1278;
  float fStack_1270;
  float fStack_126c;
  float local_1268;
  float fStack_1264;
  float fStack_1260;
  float fStack_125c;
  float fStack_1258;
  float fStack_1254;
  ulong local_1250;
  ulong local_1248;
  ulong local_1240;
  ulong local_1238;
  ulong local_1230;
  ulong local_1228;
  StackItemT<embree::NodeRefPtr<4>_> *local_1220;
  long local_1218;
  long local_1210;
  RayHitK<4> *local_1208;
  long local_1200;
  Scene *local_11f8;
  ulong local_11f0;
  ulong local_11e8;
  ulong local_11e0;
  float local_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  float local_11c8;
  float fStack_11c4;
  float fStack_11c0;
  float fStack_11bc;
  float local_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  float local_11a8;
  float fStack_11a4;
  float fStack_11a0;
  float fStack_119c;
  undefined1 local_1198 [16];
  undefined1 local_1188 [16];
  float local_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  vint<4> sx;
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  undefined1 local_1148 [8];
  float fStack_1140;
  float fStack_113c;
  undefined1 local_1138 [8];
  float fStack_1130;
  float fStack_112c;
  undefined4 local_1128;
  undefined4 uStack_1124;
  undefined4 uStack_1120;
  undefined4 uStack_111c;
  undefined1 local_1118 [16];
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  uint local_10e8;
  uint uStack_10e4;
  uint uStack_10e0;
  uint uStack_10dc;
  uint local_10d8;
  uint uStack_10d4;
  uint uStack_10d0;
  uint uStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  undefined8 local_1078;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [16];
  vfloat<4> dist;
  vint<4> itime;
  vfloat<4> ftime;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined4 uVar144;
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined2 uVar354;
  
  local_1220 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar287 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar168 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar169 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar326 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar334 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar359 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar363 = fVar326 * 0.99999964;
  fVar299 = fVar334 * 0.99999964;
  fVar361 = fVar359 * 0.99999964;
  fVar326 = fVar326 * 1.0000004;
  fVar334 = fVar334 * 1.0000004;
  fVar359 = fVar359 * 1.0000004;
  uVar149 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar150 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar155 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar151 = uVar149 ^ 0x10;
  uVar153 = uVar150 ^ 0x10;
  local_11e0 = uVar155 ^ 0x10;
  iVar135 = (tray->tnear).field_0.i[k];
  auVar173._4_4_ = iVar135;
  auVar173._0_4_ = iVar135;
  auVar173._8_4_ = iVar135;
  auVar173._12_4_ = iVar135;
  iVar135 = (tray->tfar).field_0.i[k];
  auVar222._4_4_ = iVar135;
  auVar222._0_4_ = iVar135;
  auVar222._8_4_ = iVar135;
  auVar222._12_4_ = iVar135;
  lVar136 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
  local_1288 = fVar299;
  fStack_1284 = fVar299;
  fStack_1280 = fVar299;
  fStack_127c = fVar299;
  local_1298 = auVar173;
  local_1208 = ray;
  local_10a8 = fVar287;
  fStack_10a4 = fVar287;
  fStack_10a0 = fVar287;
  fStack_109c = fVar287;
  local_10b8 = fVar168;
  fStack_10b4 = fVar168;
  fStack_10b0 = fVar168;
  fStack_10ac = fVar168;
  local_11a8 = fVar169;
  fStack_11a4 = fVar169;
  fStack_11a0 = fVar169;
  fStack_119c = fVar169;
  local_11b8 = fVar326;
  fStack_11b4 = fVar326;
  fStack_11b0 = fVar326;
  fStack_11ac = fVar326;
  local_11c8 = fVar334;
  fStack_11c4 = fVar334;
  fStack_11c0 = fVar334;
  fStack_11bc = fVar334;
  local_1178 = fVar359;
  fStack_1174 = fVar359;
  fStack_1170 = fVar359;
  fStack_116c = fVar359;
  local_11d8 = fVar361;
  fStack_11d4 = fVar361;
  fStack_11d0 = fVar361;
  fStack_11cc = fVar361;
  local_10c8 = fVar363;
  fStack_10c4 = fVar363;
  fStack_10c0 = fVar363;
  fStack_10bc = fVar363;
  local_1230 = uVar149;
  local_1238 = uVar150;
  local_1240 = uVar155;
  local_1248 = uVar151;
  local_1250 = uVar153;
  fVar258 = fVar299;
  fVar259 = fVar299;
  fVar325 = fVar299;
  fVar214 = fVar359;
  fVar215 = fVar359;
  fVar217 = fVar359;
  fVar305 = fVar363;
  fVar239 = fVar363;
  fVar323 = fVar363;
  fVar288 = fVar169;
  fVar289 = fVar169;
  fVar293 = fVar169;
  fVar216 = fVar287;
  fVar240 = fVar287;
  fVar360 = fVar287;
  fVar327 = fVar168;
  fVar330 = fVar168;
  fVar331 = fVar168;
  fVar294 = fVar326;
  fVar295 = fVar326;
  fVar296 = fVar326;
  fVar297 = fVar334;
  fVar307 = fVar334;
  fVar308 = fVar334;
  fVar310 = fVar361;
  fVar311 = fVar361;
  fVar313 = fVar361;
  do {
    local_12a8 = auVar222;
LAB_006714ba:
    do {
      if (local_1220 == stack) {
        return;
      }
      pSVar134 = local_1220 + -1;
      local_1220 = local_1220 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar134->dist &&
             (float)pSVar134->dist != *(float *)(ray + k * 4 + 0x80));
    uVar148 = (local_1220->ptr).ptr;
LAB_006714e6:
    if ((uVar148 & 8) == 0) {
      uVar137 = uVar148 & 0xfffffffffffffff0;
      fVar315 = *(float *)(ray + k * 4 + 0x70);
      pfVar14 = (float *)(uVar137 + 0x80 + uVar149);
      pfVar13 = (float *)(uVar137 + 0x20 + uVar149);
      auVar218._0_4_ = ((*pfVar14 * fVar315 + *pfVar13) - fVar287) * fVar363;
      auVar218._4_4_ = ((pfVar14[1] * fVar315 + pfVar13[1]) - fVar216) * fVar305;
      auVar218._8_4_ = ((pfVar14[2] * fVar315 + pfVar13[2]) - fVar240) * fVar239;
      auVar218._12_4_ = ((pfVar14[3] * fVar315 + pfVar13[3]) - fVar360) * fVar323;
      pfVar14 = (float *)(uVar137 + 0x80 + uVar150);
      pfVar13 = (float *)(uVar137 + 0x20 + uVar150);
      auVar241._0_4_ = ((*pfVar14 * fVar315 + *pfVar13) - fVar168) * fVar299;
      auVar241._4_4_ = ((pfVar14[1] * fVar315 + pfVar13[1]) - fVar327) * fVar258;
      auVar241._8_4_ = ((pfVar14[2] * fVar315 + pfVar13[2]) - fVar330) * fVar259;
      auVar241._12_4_ = ((pfVar14[3] * fVar315 + pfVar13[3]) - fVar331) * fVar325;
      pfVar14 = (float *)(uVar137 + 0x80 + uVar155);
      pfVar13 = (float *)(uVar137 + 0x20 + uVar155);
      auVar191._0_4_ = ((*pfVar14 * fVar315 + *pfVar13) - fVar169) * fVar361;
      auVar191._4_4_ = ((pfVar14[1] * fVar315 + pfVar13[1]) - fVar288) * fVar310;
      auVar191._8_4_ = ((pfVar14[2] * fVar315 + pfVar13[2]) - fVar289) * fVar311;
      auVar191._12_4_ = ((pfVar14[3] * fVar315 + pfVar13[3]) - fVar293) * fVar313;
      auVar242 = maxps(auVar241,auVar191);
      auVar192 = maxps(auVar173,auVar218);
      tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar192,auVar242);
      pfVar14 = (float *)(uVar137 + 0x80 + uVar151);
      pfVar13 = (float *)(uVar137 + 0x20 + uVar151);
      auVar243._0_4_ = ((*pfVar14 * fVar315 + *pfVar13) - fVar287) * fVar326;
      auVar243._4_4_ = ((pfVar14[1] * fVar315 + pfVar13[1]) - fVar216) * fVar294;
      auVar243._8_4_ = ((pfVar14[2] * fVar315 + pfVar13[2]) - fVar240) * fVar295;
      auVar243._12_4_ = ((pfVar14[3] * fVar315 + pfVar13[3]) - fVar360) * fVar296;
      pfVar14 = (float *)(uVar137 + 0x80 + uVar153);
      pfVar13 = (float *)(uVar137 + 0x20 + uVar153);
      auVar261._0_4_ = ((*pfVar14 * fVar315 + *pfVar13) - fVar168) * fVar334;
      auVar261._4_4_ = ((pfVar14[1] * fVar315 + pfVar13[1]) - fVar327) * fVar297;
      auVar261._8_4_ = ((pfVar14[2] * fVar315 + pfVar13[2]) - fVar330) * fVar307;
      auVar261._12_4_ = ((pfVar14[3] * fVar315 + pfVar13[3]) - fVar331) * fVar308;
      pfVar14 = (float *)(uVar137 + 0x80 + local_11e0);
      pfVar13 = (float *)(uVar137 + 0x20 + local_11e0);
      auVar219._0_4_ = ((*pfVar14 * fVar315 + *pfVar13) - fVar169) * fVar359;
      auVar219._4_4_ = ((pfVar14[1] * fVar315 + pfVar13[1]) - fVar288) * fVar214;
      auVar219._8_4_ = ((pfVar14[2] * fVar315 + pfVar13[2]) - fVar289) * fVar215;
      auVar219._12_4_ = ((pfVar14[3] * fVar315 + pfVar13[3]) - fVar293) * fVar217;
      auVar242 = minps(auVar261,auVar219);
      auVar192 = minps(auVar222,auVar243);
      auVar192 = minps(auVar192,auVar242);
      if (((uint)uVar148 & 7) == 6) {
        bVar24 = (fVar315 < *(float *)(uVar137 + 0xf0) && *(float *)(uVar137 + 0xe0) <= fVar315) &&
                 tNear.field_0._0_4_ <= auVar192._0_4_;
        bVar25 = (fVar315 < *(float *)(uVar137 + 0xf4) && *(float *)(uVar137 + 0xe4) <= fVar315) &&
                 tNear.field_0._4_4_ <= auVar192._4_4_;
        bVar26 = (fVar315 < *(float *)(uVar137 + 0xf8) && *(float *)(uVar137 + 0xe8) <= fVar315) &&
                 tNear.field_0._8_4_ <= auVar192._8_4_;
        bVar27 = (fVar315 < *(float *)(uVar137 + 0xfc) && *(float *)(uVar137 + 0xec) <= fVar315) &&
                 tNear.field_0._12_4_ <= auVar192._12_4_;
      }
      else {
        bVar24 = tNear.field_0._0_4_ <= auVar192._0_4_;
        bVar25 = tNear.field_0._4_4_ <= auVar192._4_4_;
        bVar26 = tNear.field_0._8_4_ <= auVar192._8_4_;
        bVar27 = tNear.field_0._12_4_ <= auVar192._12_4_;
      }
      auVar170._0_4_ = (uint)bVar24 * -0x80000000;
      auVar170._4_4_ = (uint)bVar25 * -0x80000000;
      auVar170._8_4_ = (uint)bVar26 * -0x80000000;
      auVar170._12_4_ = (uint)bVar27 * -0x80000000;
      uVar141 = movmskps((int)local_11e0,auVar170);
      if (uVar141 != 0) {
        uVar141 = uVar141 & 0xff;
        lVar138 = 0;
        if (uVar141 != 0) {
          for (; (uVar141 >> lVar138 & 1) == 0; lVar138 = lVar138 + 1) {
          }
        }
        uVar148 = *(ulong *)(uVar137 + lVar138 * 8);
        uVar141 = uVar141 - 1 & uVar141;
        if (uVar141 != 0) {
          uVar156 = tNear.field_0.i[lVar138];
          lVar138 = 0;
          if (uVar141 != 0) {
            for (; (uVar141 >> lVar138 & 1) == 0; lVar138 = lVar138 + 1) {
            }
          }
          uVar17 = *(ulong *)(uVar137 + lVar138 * 8);
          uVar157 = tNear.field_0.i[lVar138];
          uVar141 = uVar141 - 1 & uVar141;
          if (uVar141 == 0) {
            if (uVar156 < uVar157) {
              (local_1220->ptr).ptr = uVar17;
              local_1220->dist = uVar157;
              local_1220 = local_1220 + 1;
            }
            else {
              (local_1220->ptr).ptr = uVar148;
              local_1220->dist = uVar156;
              uVar148 = uVar17;
              local_1220 = local_1220 + 1;
            }
          }
          else {
            auVar171._8_4_ = uVar156;
            auVar171._0_8_ = uVar148;
            auVar171._12_4_ = 0;
            auVar193._8_4_ = uVar157;
            auVar193._0_8_ = uVar17;
            auVar193._12_4_ = 0;
            lVar138 = 0;
            if (uVar141 != 0) {
              for (; (uVar141 >> lVar138 & 1) == 0; lVar138 = lVar138 + 1) {
              }
            }
            uVar148 = *(ulong *)(uVar137 + lVar138 * 8);
            iVar135 = tNear.field_0.i[lVar138];
            auVar220._8_4_ = iVar135;
            auVar220._0_8_ = uVar148;
            auVar220._12_4_ = 0;
            auVar244._8_4_ = -(uint)((int)uVar156 < (int)uVar157);
            uVar141 = uVar141 - 1 & uVar141;
            auVar222 = local_12a8;
            if (uVar141 == 0) {
              auVar244._4_4_ = auVar244._8_4_;
              auVar244._0_4_ = auVar244._8_4_;
              auVar244._12_4_ = auVar244._8_4_;
              auVar192 = auVar171 & auVar244 | ~auVar244 & auVar193;
              auVar242 = auVar193 & auVar244 | ~auVar244 & auVar171;
              auVar245._8_4_ = -(uint)(auVar192._8_4_ < iVar135);
              auVar245._0_8_ = CONCAT44(auVar245._8_4_,auVar245._8_4_);
              auVar245._12_4_ = auVar245._8_4_;
              uVar148 = ~auVar245._0_8_ & uVar148 | auVar192._0_8_ & auVar245._0_8_;
              auVar192 = auVar220 & auVar245 | ~auVar245 & auVar192;
              auVar172._8_4_ = -(uint)(auVar242._8_4_ < auVar192._8_4_);
              auVar172._4_4_ = auVar172._8_4_;
              auVar172._0_4_ = auVar172._8_4_;
              auVar172._12_4_ = auVar172._8_4_;
              *local_1220 = (StackItemT<embree::NodeRefPtr<4>_>)
                            (~auVar172 & auVar242 | auVar192 & auVar172);
              local_1220[1] =
                   (StackItemT<embree::NodeRefPtr<4>_>)(auVar242 & auVar172 | ~auVar172 & auVar192);
              local_1220 = local_1220 + 2;
            }
            else {
              lVar138 = 0;
              if (uVar141 != 0) {
                for (; (uVar141 >> lVar138 & 1) == 0; lVar138 = lVar138 + 1) {
                }
              }
              iVar16 = tNear.field_0.i[lVar138];
              auVar262._8_4_ = iVar16;
              auVar262._0_8_ = *(undefined8 *)(uVar137 + lVar138 * 8);
              auVar262._12_4_ = 0;
              auVar246._4_4_ = auVar244._8_4_;
              auVar246._0_4_ = auVar244._8_4_;
              auVar246._8_4_ = auVar244._8_4_;
              auVar246._12_4_ = auVar244._8_4_;
              auVar173 = auVar171 & auVar246 | ~auVar246 & auVar193;
              auVar192 = auVar193 & auVar246 | ~auVar246 & auVar171;
              auVar269._0_4_ = -(uint)(iVar135 < iVar16);
              auVar269._4_4_ = -(uint)(iVar135 < iVar16);
              auVar269._8_4_ = -(uint)(iVar135 < iVar16);
              auVar269._12_4_ = -(uint)(iVar135 < iVar16);
              auVar242 = auVar220 & auVar269 | ~auVar269 & auVar262;
              auVar270 = ~auVar269 & auVar220 | auVar262 & auVar269;
              auVar221._8_4_ = -(uint)(auVar192._8_4_ < auVar270._8_4_);
              auVar221._4_4_ = auVar221._8_4_;
              auVar221._0_4_ = auVar221._8_4_;
              auVar221._12_4_ = auVar221._8_4_;
              auVar263 = auVar192 & auVar221 | ~auVar221 & auVar270;
              auVar194._8_4_ = -(uint)(auVar173._8_4_ < auVar242._8_4_);
              auVar194._0_8_ = CONCAT44(auVar194._8_4_,auVar194._8_4_);
              auVar194._12_4_ = auVar194._8_4_;
              uVar148 = auVar173._0_8_ & auVar194._0_8_ | ~auVar194._0_8_ & auVar242._0_8_;
              auVar173 = ~auVar194 & auVar173 | auVar242 & auVar194;
              auVar174._8_4_ = -(uint)(auVar173._8_4_ < auVar263._8_4_);
              auVar174._4_4_ = auVar174._8_4_;
              auVar174._0_4_ = auVar174._8_4_;
              auVar174._12_4_ = auVar174._8_4_;
              *local_1220 = (StackItemT<embree::NodeRefPtr<4>_>)
                            (~auVar221 & auVar192 | auVar270 & auVar221);
              local_1220[1] =
                   (StackItemT<embree::NodeRefPtr<4>_>)(~auVar174 & auVar173 | auVar263 & auVar174);
              local_1220[2] =
                   (StackItemT<embree::NodeRefPtr<4>_>)(auVar173 & auVar174 | ~auVar174 & auVar263);
              local_1220 = local_1220 + 3;
              auVar173 = local_1298;
              fVar299 = local_1288;
              fVar258 = fStack_1284;
              fVar259 = fStack_1280;
              fVar325 = fStack_127c;
            }
          }
        }
        goto LAB_006714e6;
      }
      goto LAB_006714ba;
    }
    local_1218 = (ulong)((uint)uVar148 & 0xf) - 8;
    local_1228 = uVar148 & 0xfffffffffffffff0;
    for (local_1210 = 0; local_1210 != local_1218; local_1210 = local_1210 + 1) {
      lVar138 = local_1210 * 0x90;
      fVar217 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(local_1228 + 0x80 + lVar138)) *
                *(float *)(local_1228 + 0x84 + lVar138);
      uVar141 = *(uint *)(local_1228 + 0x24 + lVar138);
      auVar173 = *(undefined1 (*) [16])(local_1228 + 0x20 + lVar138);
      auVar222 = *(undefined1 (*) [16])(local_1228 + 0x30 + lVar138);
      bVar28 = (byte)uVar141;
      bVar332 = auVar173[0];
      bVar29 = (byte)(uVar141 >> 8);
      bVar341 = auVar173[1];
      bVar30 = (byte)(uVar141 >> 0x10);
      bVar343 = auVar173[2];
      bVar31 = (byte)(uVar141 >> 0x18);
      bVar345 = auVar173[3];
      cVar347 = auVar173[4];
      cVar350 = auVar173[5];
      cVar352 = auVar173[6];
      cVar355 = auVar173[7];
      cVar333 = -((byte)((bVar28 < bVar332) * bVar28 | (bVar28 >= bVar332) * bVar332) == bVar332);
      cVar342 = -((byte)((bVar29 < bVar341) * bVar29 | (bVar29 >= bVar341) * bVar341) == bVar341);
      cVar344 = -((byte)((bVar30 < bVar343) * bVar30 | (bVar30 >= bVar343) * bVar343) == bVar343);
      cVar346 = -((byte)((bVar31 < bVar345) * bVar31 | (bVar31 >= bVar345) * bVar345) == bVar345);
      cVar348 = -((char)((cVar347 == '\0') * cVar347) == cVar347);
      cVar351 = -((char)((cVar350 == '\0') * cVar350) == cVar350);
      cVar353 = -((char)((cVar352 == '\0') * cVar352) == cVar352);
      cVar356 = -((char)((cVar355 == '\0') * cVar355) == cVar355);
      auVar32[0xd] = 0;
      auVar32._0_13_ = auVar173._0_13_;
      auVar32[0xe] = cVar355;
      auVar45[0xc] = cVar352;
      auVar45._0_12_ = auVar173._0_12_;
      auVar45._13_2_ = auVar32._13_2_;
      auVar52[0xb] = 0;
      auVar52._0_11_ = auVar173._0_11_;
      auVar52._12_3_ = auVar45._12_3_;
      auVar58[10] = cVar350;
      auVar58._0_10_ = auVar173._0_10_;
      auVar58._11_4_ = auVar52._11_4_;
      auVar65[9] = 0;
      auVar65._0_9_ = auVar173._0_9_;
      auVar65._10_5_ = auVar58._10_5_;
      auVar71[8] = cVar347;
      auVar71._0_8_ = auVar173._0_8_;
      auVar71._9_6_ = auVar65._9_6_;
      auVar90._7_8_ = 0;
      auVar90._0_7_ = auVar71._8_7_;
      Var91 = CONCAT81(SUB158(auVar90 << 0x40,7),bVar345);
      auVar119._9_6_ = 0;
      auVar119._0_9_ = Var91;
      auVar92._1_10_ = SUB1510(auVar119 << 0x30,5);
      auVar92[0] = bVar343;
      auVar120._11_4_ = 0;
      auVar120._0_11_ = auVar92;
      auVar93._1_12_ = SUB1512(auVar120 << 0x20,3);
      auVar93[0] = bVar341;
      auVar83._2_13_ = auVar93;
      auVar83._0_2_ = CONCAT11(0,bVar332);
      auVar33._10_2_ = 0;
      auVar33._0_10_ = auVar83._0_10_;
      auVar33._12_2_ = (short)Var91;
      uVar131 = CONCAT42(auVar33._10_4_,auVar92._0_2_);
      auVar94._6_8_ = 0;
      auVar94._0_6_ = uVar131;
      fVar169 = *(float *)(local_1228 + 0x44 + lVar138);
      fVar326 = *(float *)(local_1228 + 0x38 + lVar138);
      fVar288 = (float)CONCAT11(0,bVar332) * fVar169 + fVar326;
      fVar293 = (float)(int)CONCAT82(SUB148(auVar94 << 0x40,6),auVar93._0_2_) * fVar169 + fVar326;
      fVar295 = (float)(int)uVar131 * fVar169 + fVar326;
      fVar297 = (float)(auVar33._10_4_ >> 0x10) * fVar169 + fVar326;
      auVar173 = *(undefined1 (*) [16])(local_1228 + 0x50 + lVar138);
      auVar34[0xd] = 0;
      auVar34._0_13_ = auVar173._0_13_;
      auVar34[0xe] = auVar173[7];
      auVar46[0xc] = auVar173[6];
      auVar46._0_12_ = auVar173._0_12_;
      auVar46._13_2_ = auVar34._13_2_;
      auVar53[0xb] = 0;
      auVar53._0_11_ = auVar173._0_11_;
      auVar53._12_3_ = auVar46._12_3_;
      auVar59[10] = auVar173[5];
      auVar59._0_10_ = auVar173._0_10_;
      auVar59._11_4_ = auVar53._11_4_;
      auVar66[9] = 0;
      auVar66._0_9_ = auVar173._0_9_;
      auVar66._10_5_ = auVar59._10_5_;
      auVar72[8] = auVar173[4];
      auVar72._0_8_ = auVar173._0_8_;
      auVar72._9_6_ = auVar66._9_6_;
      auVar95._7_8_ = 0;
      auVar95._0_7_ = auVar72._8_7_;
      Var91 = CONCAT81(SUB158(auVar95 << 0x40,7),auVar173[3]);
      auVar121._9_6_ = 0;
      auVar121._0_9_ = Var91;
      auVar96._1_10_ = SUB1510(auVar121 << 0x30,5);
      auVar96[0] = auVar173[2];
      auVar122._11_4_ = 0;
      auVar122._0_11_ = auVar96;
      auVar97._1_12_ = SUB1512(auVar122 << 0x20,3);
      auVar97[0] = auVar173[1];
      uVar190 = CONCAT11(0,auVar173[0]);
      auVar84._2_13_ = auVar97;
      auVar84._0_2_ = uVar190;
      auVar35._10_2_ = 0;
      auVar35._0_10_ = auVar84._0_10_;
      auVar35._12_2_ = (short)Var91;
      uVar131 = CONCAT42(auVar35._10_4_,auVar96._0_2_);
      auVar98._6_8_ = 0;
      auVar98._0_6_ = uVar131;
      fVar334 = *(float *)(local_1228 + 0x74 + lVar138);
      fVar359 = *(float *)(local_1228 + 0x68 + lVar138);
      auVar77[0xc] = bVar31;
      auVar77._0_12_ = ZEXT712(0);
      fVar289 = (float)(uVar141 & 0xff) * fVar169 + fVar326;
      fVar294 = (float)bVar29 * fVar169 + fVar326;
      fVar296 = (float)(int)CONCAT32(auVar77._10_3_,(ushort)bVar30) * fVar169 + fVar326;
      fVar326 = (float)(uint3)(auVar77._10_3_ >> 0x10) * fVar169 + fVar326;
      uVar141 = *(uint *)(local_1228 + 0x54 + lVar138);
      auVar78[0xc] = (char)(uVar141 >> 0x18);
      auVar78._0_12_ = ZEXT712(0);
      uVar149 = *(ulong *)(local_1228 + 0x28 + lVar138);
      auVar36._8_6_ = 0;
      auVar36._0_8_ = uVar149;
      auVar36[0xe] = (char)(uVar149 >> 0x38);
      auVar47._8_4_ = 0;
      auVar47._0_8_ = uVar149;
      auVar47[0xc] = (char)(uVar149 >> 0x30);
      auVar47._13_2_ = auVar36._13_2_;
      auVar54._8_4_ = 0;
      auVar54._0_8_ = uVar149;
      auVar54._12_3_ = auVar47._12_3_;
      auVar60._8_2_ = 0;
      auVar60._0_8_ = uVar149;
      auVar60[10] = (char)(uVar149 >> 0x28);
      auVar60._11_4_ = auVar54._11_4_;
      auVar67._8_2_ = 0;
      auVar67._0_8_ = uVar149;
      auVar67._10_5_ = auVar60._10_5_;
      auVar73[8] = (char)(uVar149 >> 0x20);
      auVar73._0_8_ = uVar149;
      auVar73._9_6_ = auVar67._9_6_;
      auVar99._7_8_ = 0;
      auVar99._0_7_ = auVar73._8_7_;
      Var91 = CONCAT81(SUB158(auVar99 << 0x40,7),(char)(uVar149 >> 0x18));
      auVar123._9_6_ = 0;
      auVar123._0_9_ = Var91;
      auVar100._1_10_ = SUB1510(auVar123 << 0x30,5);
      auVar100[0] = (char)(uVar149 >> 0x10);
      auVar124._11_4_ = 0;
      auVar124._0_11_ = auVar100;
      auVar101._1_12_ = SUB1512(auVar124 << 0x20,3);
      auVar101[0] = (char)(uVar149 >> 8);
      uVar260 = CONCAT11(0,(byte)uVar149);
      auVar85._2_13_ = auVar101;
      auVar85._0_2_ = uVar260;
      auVar37._10_2_ = 0;
      auVar37._0_10_ = auVar85._0_10_;
      auVar37._12_2_ = (short)Var91;
      uVar132 = CONCAT42(auVar37._10_4_,auVar100._0_2_);
      auVar102._6_8_ = 0;
      auVar102._0_6_ = uVar132;
      fVar169 = *(float *)(local_1228 + 0x48 + lVar138);
      fVar299 = *(float *)(local_1228 + 0x3c + lVar138);
      fVar307 = (float)uVar260 * fVar169 + fVar299;
      fVar310 = (float)(int)CONCAT82(SUB148(auVar102 << 0x40,6),auVar101._0_2_) * fVar169 + fVar299;
      fVar313 = (float)(int)uVar132 * fVar169 + fVar299;
      fVar315 = (float)(auVar37._10_4_ >> 0x10) * fVar169 + fVar299;
      uVar149 = *(ulong *)(local_1228 + 0x58 + lVar138);
      auVar38._8_6_ = 0;
      auVar38._0_8_ = uVar149;
      auVar38[0xe] = (char)(uVar149 >> 0x38);
      auVar48._8_4_ = 0;
      auVar48._0_8_ = uVar149;
      auVar48[0xc] = (char)(uVar149 >> 0x30);
      auVar48._13_2_ = auVar38._13_2_;
      auVar55._8_4_ = 0;
      auVar55._0_8_ = uVar149;
      auVar55._12_3_ = auVar48._12_3_;
      auVar61._8_2_ = 0;
      auVar61._0_8_ = uVar149;
      auVar61[10] = (char)(uVar149 >> 0x28);
      auVar61._11_4_ = auVar55._11_4_;
      auVar68._8_2_ = 0;
      auVar68._0_8_ = uVar149;
      auVar68._10_5_ = auVar61._10_5_;
      auVar74[8] = (char)(uVar149 >> 0x20);
      auVar74._0_8_ = uVar149;
      auVar74._9_6_ = auVar68._9_6_;
      auVar103._7_8_ = 0;
      auVar103._0_7_ = auVar74._8_7_;
      Var91 = CONCAT81(SUB158(auVar103 << 0x40,7),(char)(uVar149 >> 0x18));
      auVar125._9_6_ = 0;
      auVar125._0_9_ = Var91;
      auVar104._1_10_ = SUB1510(auVar125 << 0x30,5);
      auVar104[0] = (char)(uVar149 >> 0x10);
      auVar126._11_4_ = 0;
      auVar126._0_11_ = auVar104;
      auVar105._1_12_ = SUB1512(auVar126 << 0x20,3);
      auVar105[0] = (char)(uVar149 >> 8);
      uVar260 = CONCAT11(0,(byte)uVar149);
      auVar86._2_13_ = auVar105;
      auVar86._0_2_ = uVar260;
      auVar39._10_2_ = 0;
      auVar39._0_10_ = auVar86._0_10_;
      auVar39._12_2_ = (short)Var91;
      uVar132 = CONCAT42(auVar39._10_4_,auVar104._0_2_);
      auVar106._6_8_ = 0;
      auVar106._0_6_ = uVar132;
      fVar258 = *(float *)(local_1228 + 0x78 + lVar138);
      fVar259 = *(float *)(local_1228 + 0x6c + lVar138);
      uVar156 = *(uint *)(local_1228 + 0x2c + lVar138);
      auVar79[0xc] = (char)(uVar156 >> 0x18);
      auVar79._0_12_ = ZEXT712(0);
      fVar308 = (float)(uVar156 & 0xff) * fVar169 + fVar299;
      fVar311 = (float)(uVar156 >> 8 & 0xff) * fVar169 + fVar299;
      fVar361 = (float)(int)CONCAT32(auVar79._10_3_,(ushort)(byte)(uVar156 >> 0x10)) * fVar169 +
                fVar299;
      fVar299 = (float)(uint3)(auVar79._10_3_ >> 0x10) * fVar169 + fVar299;
      uVar156 = *(uint *)(local_1228 + 0x5c + lVar138);
      auVar80[0xc] = (char)(uVar156 >> 0x18);
      auVar80._0_12_ = ZEXT712(0);
      auVar40[0xd] = 0;
      auVar40._0_13_ = auVar222._0_13_;
      auVar40[0xe] = auVar222[7];
      auVar49[0xc] = auVar222[6];
      auVar49._0_12_ = auVar222._0_12_;
      auVar49._13_2_ = auVar40._13_2_;
      auVar56[0xb] = 0;
      auVar56._0_11_ = auVar222._0_11_;
      auVar56._12_3_ = auVar49._12_3_;
      auVar62[10] = auVar222[5];
      auVar62._0_10_ = auVar222._0_10_;
      auVar62._11_4_ = auVar56._11_4_;
      auVar69[9] = 0;
      auVar69._0_9_ = auVar222._0_9_;
      auVar69._10_5_ = auVar62._10_5_;
      auVar75[8] = auVar222[4];
      auVar75._0_8_ = auVar222._0_8_;
      auVar75._9_6_ = auVar69._9_6_;
      auVar107._7_8_ = 0;
      auVar107._0_7_ = auVar75._8_7_;
      Var91 = CONCAT81(SUB158(auVar107 << 0x40,7),auVar222[3]);
      auVar127._9_6_ = 0;
      auVar127._0_9_ = Var91;
      auVar108._1_10_ = SUB1510(auVar127 << 0x30,5);
      auVar108[0] = auVar222[2];
      auVar128._11_4_ = 0;
      auVar128._0_11_ = auVar108;
      auVar109._1_12_ = SUB1512(auVar128 << 0x20,3);
      auVar109[0] = auVar222[1];
      uVar268 = CONCAT11(0,auVar222[0]);
      auVar87._2_13_ = auVar109;
      auVar87._0_2_ = uVar268;
      auVar41._10_2_ = 0;
      auVar41._0_10_ = auVar87._0_10_;
      auVar41._12_2_ = (short)Var91;
      uVar133 = CONCAT42(auVar41._10_4_,auVar108._0_2_);
      auVar110._6_8_ = 0;
      auVar110._0_6_ = uVar133;
      fVar169 = *(float *)(local_1228 + 0x4c + lVar138);
      fVar325 = *(float *)(local_1228 + 0x40 + lVar138);
      fVar317 = (float)uVar268 * fVar169 + fVar325;
      fVar319 = (float)(int)CONCAT82(SUB148(auVar110 << 0x40,6),auVar109._0_2_) * fVar169 + fVar325;
      fVar321 = (float)(int)uVar133 * fVar169 + fVar325;
      fVar324 = (float)(auVar41._10_4_ >> 0x10) * fVar169 + fVar325;
      auVar173 = *(undefined1 (*) [16])(local_1228 + 0x60 + lVar138);
      auVar42[0xd] = 0;
      auVar42._0_13_ = auVar173._0_13_;
      auVar42[0xe] = auVar173[7];
      auVar50[0xc] = auVar173[6];
      auVar50._0_12_ = auVar173._0_12_;
      auVar50._13_2_ = auVar42._13_2_;
      auVar57[0xb] = 0;
      auVar57._0_11_ = auVar173._0_11_;
      auVar57._12_3_ = auVar50._12_3_;
      auVar63[10] = auVar173[5];
      auVar63._0_10_ = auVar173._0_10_;
      auVar63._11_4_ = auVar57._11_4_;
      auVar70[9] = 0;
      auVar70._0_9_ = auVar173._0_9_;
      auVar70._10_5_ = auVar63._10_5_;
      auVar76[8] = auVar173[4];
      auVar76._0_8_ = auVar173._0_8_;
      auVar76._9_6_ = auVar70._9_6_;
      auVar111._7_8_ = 0;
      auVar111._0_7_ = auVar76._8_7_;
      Var91 = CONCAT81(SUB158(auVar111 << 0x40,7),auVar173[3]);
      auVar129._9_6_ = 0;
      auVar129._0_9_ = Var91;
      auVar112._1_10_ = SUB1510(auVar129 << 0x30,5);
      auVar112[0] = auVar173[2];
      auVar130._11_4_ = 0;
      auVar130._0_11_ = auVar112;
      auVar113._1_12_ = SUB1512(auVar130 << 0x20,3);
      auVar113[0] = auVar173[1];
      uVar268 = CONCAT11(0,auVar173[0]);
      auVar88._2_13_ = auVar113;
      auVar88._0_2_ = uVar268;
      auVar43._10_2_ = 0;
      auVar43._0_10_ = auVar88._0_10_;
      auVar43._12_2_ = (short)Var91;
      uVar133 = CONCAT42(auVar43._10_4_,auVar112._0_2_);
      auVar114._6_8_ = 0;
      auVar114._0_6_ = uVar133;
      fVar214 = *(float *)(local_1228 + 0x7c + lVar138);
      fVar215 = *(float *)(local_1228 + 0x70 + lVar138);
      uVar157 = *(uint *)(local_1228 + 0x34 + lVar138);
      auVar81[0xc] = (char)(uVar157 >> 0x18);
      auVar81._0_12_ = ZEXT712(0);
      fVar318 = (float)(uVar157 & 0xff) * fVar169 + fVar325;
      fVar320 = (float)(uVar157 >> 8 & 0xff) * fVar169 + fVar325;
      fVar322 = (float)(int)CONCAT32(auVar81._10_3_,(ushort)(byte)(uVar157 >> 0x10)) * fVar169 +
                fVar325;
      fVar325 = (float)(uint3)(auVar81._10_3_ >> 0x10) * fVar169 + fVar325;
      uVar157 = *(uint *)(local_1228 + 100 + lVar138);
      auVar82[0xc] = (char)(uVar157 >> 0x18);
      auVar82._0_12_ = ZEXT712(0);
      auVar192._0_8_ =
           CONCAT44((((((float)(int)CONCAT82(SUB148(auVar98 << 0x40,6),auVar97._0_2_) * fVar334 +
                       fVar359) - fVar293) * fVar217 + fVar293) - fVar216) * fVar305,
                    (((((float)uVar190 * fVar334 + fVar359) - fVar288) * fVar217 + fVar288) -
                    fVar287) * fVar363);
      auVar192._8_4_ =
           (((((float)(int)uVar131 * fVar334 + fVar359) - fVar295) * fVar217 + fVar295) - fVar240) *
           fVar239;
      auVar192._12_4_ =
           (((((float)(auVar35._10_4_ >> 0x10) * fVar334 + fVar359) - fVar297) * fVar217 + fVar297)
           - fVar360) * fVar323;
      auVar264._0_8_ =
           CONCAT44((((((float)(int)CONCAT82(SUB148(auVar106 << 0x40,6),auVar105._0_2_) * fVar258 +
                       fVar259) - fVar310) * fVar217 + fVar310) - fVar327) * fStack_1284,
                    (((((float)uVar260 * fVar258 + fVar259) - fVar307) * fVar217 + fVar307) -
                    fVar168) * local_1288);
      auVar264._8_4_ =
           (((((float)(int)uVar132 * fVar258 + fVar259) - fVar313) * fVar217 + fVar313) - fVar330) *
           fStack_1280;
      auVar264._12_4_ =
           (((((float)(auVar39._10_4_ >> 0x10) * fVar258 + fVar259) - fVar315) * fVar217 + fVar315)
           - fVar331) * fStack_127c;
      auVar270._0_4_ =
           (((((float)(uVar141 & 0xff) * fVar334 + fVar359) - fVar289) * fVar217 + fVar289) -
           fVar287) * local_11b8;
      auVar270._4_4_ =
           (((((float)(uVar141 >> 8 & 0xff) * fVar334 + fVar359) - fVar294) * fVar217 + fVar294) -
           fVar216) * fStack_11b4;
      auVar270._8_4_ =
           (((((float)(int)CONCAT32(auVar78._10_3_,(ushort)(byte)(uVar141 >> 0x10)) * fVar334 +
              fVar359) - fVar296) * fVar217 + fVar296) - fVar240) * fStack_11b0;
      auVar270._12_4_ =
           (((((float)(uint3)(auVar78._10_3_ >> 0x10) * fVar334 + fVar359) - fVar326) * fVar217 +
            fVar326) - fVar360) * fStack_11ac;
      auVar280._0_4_ =
           (((((float)(uVar156 & 0xff) * fVar258 + fVar259) - fVar308) * fVar217 + fVar308) -
           fVar168) * local_11c8;
      auVar280._4_4_ =
           (((((float)(uVar156 >> 8 & 0xff) * fVar258 + fVar259) - fVar311) * fVar217 + fVar311) -
           fVar327) * fStack_11c4;
      auVar280._8_4_ =
           (((((float)(int)CONCAT32(auVar80._10_3_,(ushort)(byte)(uVar156 >> 0x10)) * fVar258 +
              fVar259) - fVar361) * fVar217 + fVar361) - fVar330) * fStack_11c0;
      auVar280._12_4_ =
           (((((float)(uint3)(auVar80._10_3_ >> 0x10) * fVar258 + fVar259) - fVar299) * fVar217 +
            fVar299) - fVar331) * fStack_11bc;
      auVar242._8_4_ = auVar192._8_4_;
      auVar242._0_8_ = auVar192._0_8_;
      auVar242._12_4_ = auVar192._12_4_;
      auVar222 = minps(auVar242,auVar270);
      auVar173 = maxps(auVar192,auVar270);
      auVar247._8_4_ = auVar264._8_4_;
      auVar247._0_8_ = auVar264._0_8_;
      auVar247._12_4_ = auVar264._12_4_;
      auVar192 = minps(auVar247,auVar280);
      auVar222 = maxps(auVar222,auVar192);
      auVar192 = maxps(auVar264,auVar280);
      auVar271._0_8_ =
           CONCAT44((((((float)(int)CONCAT82(SUB148(auVar114 << 0x40,6),auVar113._0_2_) * fVar214 +
                       fVar215) - fVar319) * fVar217 + fVar319) - fStack_11a4) * fStack_11d4,
                    (((((float)uVar268 * fVar214 + fVar215) - fVar317) * fVar217 + fVar317) -
                    local_11a8) * local_11d8);
      auVar271._8_4_ =
           (((((float)(int)uVar133 * fVar214 + fVar215) - fVar321) * fVar217 + fVar321) -
           fStack_11a0) * fStack_11d0;
      auVar271._12_4_ =
           (((((float)(auVar43._10_4_ >> 0x10) * fVar214 + fVar215) - fVar324) * fVar217 + fVar324)
           - fStack_119c) * fStack_11cc;
      auVar290._0_4_ =
           (((((float)(uVar157 & 0xff) * fVar214 + fVar215) - fVar318) * fVar217 + fVar318) -
           local_11a8) * local_1178;
      auVar290._4_4_ =
           (((((float)(uVar157 >> 8 & 0xff) * fVar214 + fVar215) - fVar320) * fVar217 + fVar320) -
           fStack_11a4) * fStack_1174;
      auVar290._8_4_ =
           (((((float)(int)CONCAT32(auVar82._10_3_,(ushort)(byte)(uVar157 >> 0x10)) * fVar214 +
              fVar215) - fVar322) * fVar217 + fVar322) - fStack_11a0) * fStack_1170;
      auVar290._12_4_ =
           (((((float)(uint3)(auVar82._10_3_ >> 0x10) * fVar214 + fVar215) - fVar325) * fVar217 +
            fVar325) - fStack_119c) * fStack_116c;
      auVar173 = minps(auVar173,auVar192);
      auVar248._8_4_ = auVar271._8_4_;
      auVar248._0_8_ = auVar271._0_8_;
      auVar248._12_4_ = auVar271._12_4_;
      auVar192 = minps(auVar248,auVar290);
      auVar242 = maxps(auVar271,auVar290);
      auVar192 = maxps(auVar192,local_1298);
      dist.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar222,auVar192);
      auVar222 = minps(auVar242,local_12a8);
      auVar173 = minps(auVar173,auVar222);
      auVar263._0_4_ = -(uint)(auVar173._0_4_ < dist.field_0._0_4_);
      auVar263._4_4_ = -(uint)(auVar173._4_4_ < dist.field_0._4_4_);
      auVar263._8_4_ = -(uint)(auVar173._8_4_ < dist.field_0._8_4_);
      auVar263._12_4_ = -(uint)(auVar173._12_4_ < dist.field_0._12_4_);
      Var117 = CONCAT91(CONCAT81((long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(
                                                  CONCAT11(cVar356,cVar356),cVar353),cVar353),
                                                  cVar351),cVar351),cVar348),
                                                 CONCAT11(cVar348,cVar356)) >> 8),cVar346),cVar346);
      auVar116._2_10_ = Var117;
      auVar116[1] = cVar344;
      auVar116[0] = cVar344;
      auVar115._2_12_ = auVar116;
      auVar115[1] = cVar342;
      auVar115[0] = cVar342;
      auVar336._0_2_ = CONCAT11(cVar333,cVar333);
      auVar336._2_14_ = auVar115;
      uVar354 = (undefined2)Var117;
      auVar340._0_12_ = auVar336._0_12_;
      auVar340._12_2_ = uVar354;
      auVar340._14_2_ = uVar354;
      auVar339._12_4_ = auVar340._12_4_;
      auVar339._0_10_ = auVar336._0_10_;
      auVar339._10_2_ = auVar116._0_2_;
      auVar338._10_6_ = auVar339._10_6_;
      auVar338._0_8_ = auVar336._0_8_;
      auVar338._8_2_ = auVar116._0_2_;
      auVar337._8_8_ = auVar338._8_8_;
      auVar337._6_2_ = auVar115._0_2_;
      auVar337._4_2_ = auVar115._0_2_;
      auVar337._2_2_ = auVar336._0_2_;
      auVar337._0_2_ = auVar336._0_2_;
      uVar144 = (undefined4)k;
      uVar146 = (undefined4)(k >> 0x20);
      uVar143 = movmskps(uVar144,~auVar263 & auVar337);
      local_11e8 = CONCAT44(uVar146,uVar143);
      local_1200 = lVar138 + local_1228;
      auVar173 = local_1298;
      fVar299 = local_1288;
      fVar258 = fStack_1284;
      fVar259 = fStack_1280;
      fVar325 = fStack_127c;
      fVar359 = local_1178;
      fVar214 = fStack_1174;
      fVar215 = fStack_1170;
      fVar217 = fStack_116c;
      while (lVar138 = local_1200, local_11e8 != 0) {
        lVar23 = 0;
        if (local_11e8 != 0) {
          for (; (local_11e8 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
          }
        }
        local_11e8 = local_11e8 - 1 & local_11e8;
        local_fb8 = ZEXT416((uint)*(float *)(ray + k * 4 + 0x80));
        if (dist.field_0.v[lVar23] <= *(float *)(ray + k * 4 + 0x80)) {
          local_11f0 = (ulong)*(uint *)(local_1200 + 0x88);
          local_1410 = (ulong)*(uint *)(local_1200 + 4 + lVar23 * 8);
          local_11f8 = context->scene;
          pGVar18 = (local_11f8->geometries).items[local_11f0].ptr;
          lVar19 = *(long *)&pGVar18->field_0x58;
          lVar154 = local_1410 *
                    pGVar18[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          fVar168 = (pGVar18->time_range).lower;
          auVar195._0_4_ = (pGVar18->time_range).upper - fVar168;
          fVar287 = pGVar18->fnumTimeSegments;
          auVar249._0_4_ = *(float *)(ray + 0x70) - fVar168;
          auVar249._4_4_ = *(float *)(ray + 0x74) - fVar168;
          auVar249._8_4_ = *(float *)(ray + 0x78) - fVar168;
          auVar249._12_4_ = *(float *)(ray + 0x7c) - fVar168;
          auVar195._4_4_ = auVar195._0_4_;
          auVar195._8_4_ = auVar195._0_4_;
          auVar195._12_4_ = auVar195._0_4_;
          auVar173 = divps(auVar249,auVar195);
          fVar359 = auVar173._0_4_ * fVar287;
          fVar299 = auVar173._4_4_ * fVar287;
          fVar258 = auVar173._8_4_ * fVar287;
          fVar259 = auVar173._12_4_ * fVar287;
          fVar168 = floorf(fVar258);
          fVar169 = floorf(fVar259);
          fVar326 = floorf(fVar359);
          fVar334 = floorf(fVar299);
          uVar153 = local_11f0;
          ray = local_1208;
          auVar223._4_4_ = fVar334;
          auVar223._0_4_ = fVar326;
          auVar223._8_4_ = fVar168;
          auVar223._12_4_ = fVar169;
          auVar175._0_4_ = fVar287 + -1.0;
          auVar175._4_4_ = auVar175._0_4_;
          auVar175._8_4_ = auVar175._0_4_;
          auVar175._12_4_ = auVar175._0_4_;
          auVar173 = minps(auVar223,auVar175);
          auVar196._0_12_ = ZEXT812(0);
          auVar196._12_4_ = 0;
          auVar173 = maxps(auVar173,auVar196);
          ftime.field_0.v[0] = fVar359 - auVar173._0_4_;
          ftime.field_0.v[1] = fVar299 - auVar173._4_4_;
          ftime.field_0.v[2] = fVar258 - auVar173._8_4_;
          ftime.field_0.v[3] = fVar259 - auVar173._12_4_;
          itime.field_0.i[0] = (int)auVar173._0_4_;
          itime.field_0.i[1] = (int)auVar173._4_4_;
          itime.field_0.i[2] = (int)auVar173._8_4_;
          itime.field_0.i[3] = (int)auVar173._12_4_;
          uVar149 = *(ulong *)(lVar138 + lVar23 * 8);
          auVar176._8_8_ = 0;
          auVar176._0_8_ = uVar149;
          auVar176 = auVar176 & _DAT_01f76ac0;
          auVar44._10_2_ = 0;
          auVar44._0_10_ = auVar176._0_10_;
          auVar44._12_2_ = auVar176._6_2_;
          auVar51._8_2_ = auVar176._4_2_;
          auVar51._0_8_ = auVar176._0_8_;
          auVar51._10_4_ = auVar44._10_4_;
          auVar118._6_8_ = 0;
          auVar118._0_6_ = auVar51._8_6_;
          auVar64._4_2_ = auVar176._2_2_;
          auVar64._0_4_ = auVar176._0_4_;
          auVar64._6_8_ = SUB148(auVar118 << 0x40,6);
          sx.field_0.i[0] = (int)auVar176._0_2_;
          uVar150 = *(ulong *)(lVar19 + lVar154);
          uVar151 = (ulong)(uint)((int)((ulong)(auVar176._0_4_ >> 0x10) * (uVar150 >> 0x20)) +
                                 (int)uVar150 + sx.field_0.i[0]);
          lVar23 = *(long *)&pGVar18[2].numPrimitives;
          lVar145 = (long)itime.field_0.i[k] * 0x38;
          lVar20 = *(long *)(lVar23 + lVar145);
          lVar21 = *(long *)(lVar23 + 0x10 + lVar145);
          pfVar13 = (float *)(lVar20 + lVar21 * uVar151);
          lVar22 = *(long *)(lVar23 + 0x48 + lVar145);
          pfVar14 = (float *)(lVar20 + (uVar151 + 1) * lVar21);
          uVar150 = uVar150 >> 0x20;
          lVar138 = uVar151 + uVar150;
          lVar152 = uVar151 + uVar150 + 1;
          pfVar1 = (float *)(lVar20 + lVar138 * lVar21);
          pfVar2 = (float *)(lVar20 + lVar152 * lVar21);
          uVar155 = (ulong)(-1 < (short)uVar149);
          lVar142 = uVar151 + uVar155 + 1;
          pfVar3 = (float *)(lVar20 + lVar142 * lVar21);
          lVar147 = uVar155 + lVar152;
          pfVar4 = (float *)(lVar20 + lVar147 * lVar21);
          uVar155 = 0;
          if (-1 < (short)(uVar149 >> 0x10)) {
            uVar155 = uVar150;
          }
          pfVar5 = (float *)(lVar20 + (lVar138 + uVar155) * lVar21);
          pfVar6 = (float *)(lVar20 + (lVar152 + uVar155) * lVar21);
          fVar359 = *(float *)(lVar20 + lVar21 * (uVar155 + lVar147) + 4);
          lVar23 = *(long *)(lVar23 + 0x38 + lVar145);
          pfVar7 = (float *)(lVar23 + lVar22 * uVar151);
          pfVar8 = (float *)(lVar23 + lVar22 * (uVar151 + 1));
          pfVar9 = (float *)(lVar23 + lVar22 * lVar138);
          pfVar10 = (float *)(lVar23 + lVar22 * lVar152);
          pfVar11 = (float *)(lVar23 + lVar22 * lVar142);
          fVar287 = *(float *)((long)&stack[-1].ptr.ptr + k * 4);
          pfVar12 = (float *)(lVar23 + lVar22 * lVar147);
          fVar321 = (*pfVar8 - *pfVar14) * fVar287 + *pfVar14;
          local_1088 = (pfVar8[1] - pfVar14[1]) * fVar287 + pfVar14[1];
          fVar325 = (pfVar8[2] - pfVar14[2]) * fVar287 + pfVar14[2];
          pfVar14 = (float *)(lVar23 + lVar22 * (lVar138 + uVar155));
          fVar217 = (*pfVar9 - *pfVar1) * fVar287 + *pfVar1;
          local_1098 = (pfVar9[1] - pfVar1[1]) * fVar287 + pfVar1[1];
          local_1448._0_4_ = (pfVar9[2] - pfVar1[2]) * fVar287 + pfVar1[2];
          pfVar1 = (float *)(lVar23 + lVar22 * (lVar152 + uVar155));
          fVar319 = (*pfVar10 - *pfVar2) * fVar287 + *pfVar2;
          fVar363 = (pfVar10[1] - pfVar2[1]) * fVar287 + pfVar2[1];
          fVar320 = (pfVar10[2] - pfVar2[2]) * fVar287 + pfVar2[2];
          fVar299 = *(float *)(lVar23 + (uVar155 + lVar147) * lVar22 + 4);
          fStack_1084 = (pfVar11[1] - pfVar3[1]) * fVar287 + pfVar3[1];
          fVar323 = (pfVar11[2] - pfVar3[2]) * fVar287 + pfVar3[2];
          fVar300 = (*pfVar12 - *pfVar4) * fVar287 + *pfVar4;
          fVar305 = (pfVar12[1] - pfVar4[1]) * fVar287 + pfVar4[1];
          fVar306 = (pfVar12[2] - pfVar4[2]) * fVar287 + pfVar4[2];
          fStack_1264 = (*pfVar14 - *pfVar5) * fVar287 + *pfVar5;
          fStack_108c = (pfVar14[1] - pfVar5[1]) * fVar287 + pfVar5[1];
          fStack_1054 = (pfVar14[2] - pfVar5[2]) * fVar287 + pfVar5[2];
          local_1268 = (*pfVar1 - *pfVar6) * fVar287 + *pfVar6;
          fVar239 = (pfVar1[1] - pfVar6[1]) * fVar287 + pfVar6[1];
          local_1058 = (pfVar1[2] - pfVar6[2]) * fVar287 + pfVar6[2];
          fVar168 = *(float *)(local_1208 + k * 4);
          fVar258 = ((*pfVar7 - *pfVar13) * fVar287 + *pfVar13) - fVar168;
          fVar214 = fVar321 - fVar168;
          fVar288 = fVar319 - fVar168;
          fVar216 = fVar217 - fVar168;
          fStack_1258 = fVar300;
          fStack_1254 = fVar319;
          fVar321 = fVar321 - fVar168;
          fVar322 = ((*pfVar11 - *pfVar3) * fVar287 + *pfVar3) - fVar168;
          fVar324 = fVar300 - fVar168;
          fVar298 = fVar319 - fVar168;
          local_1278 = CONCAT44(fVar319,fVar217);
          fVar217 = fVar217 - fVar168;
          fVar289 = fVar319 - fVar168;
          fVar240 = local_1268 - fVar168;
          fVar168 = fStack_1264 - fVar168;
          fVar169 = *(float *)(local_1208 + k * 4 + 0x10);
          fVar326 = *(float *)(local_1208 + k * 4 + 0x20);
          local_fc8 = ((pfVar7[1] - pfVar13[1]) * fVar287 + pfVar13[1]) - fVar169;
          fStack_fc4 = local_1088 - fVar169;
          fStack_fc0 = fVar363 - fVar169;
          fStack_fbc = local_1098 - fVar169;
          local_fd8 = ((pfVar7[2] - pfVar13[2]) * fVar287 + pfVar13[2]) - fVar326;
          fStack_fd4 = fVar325 - fVar326;
          fStack_fd0 = fVar320 - fVar326;
          fStack_fcc = (float)local_1448 - fVar326;
          fStack_1094 = fVar363;
          fStack_1090 = fVar239;
          fVar295 = local_1098 - fVar169;
          fVar296 = fVar363 - fVar169;
          fVar297 = fVar239 - fVar169;
          fVar307 = fStack_108c - fVar169;
          local_1448._0_4_ = (float)local_1448 - fVar326;
          local_1448._4_4_ = fVar320 - fVar326;
          uStack_1440._0_4_ = local_1058 - fVar326;
          uStack_1440._4_4_ = fStack_1054 - fVar326;
          local_fe8 = fVar217 - fVar258;
          fStack_fe4 = fVar289 - fVar214;
          fStack_fe0 = fVar240 - fVar288;
          fStack_fdc = fVar168 - fVar216;
          local_1008 = fVar295 - local_fc8;
          fStack_1004 = fVar296 - fStack_fc4;
          fStack_1000 = fVar297 - fStack_fc0;
          fStack_ffc = fVar307 - fStack_fbc;
          local_ff8 = (float)local_1448 - local_fd8;
          fStack_ff4 = local_1448._4_4_ - fStack_fd4;
          fStack_ff0 = (float)uStack_1440 - fStack_fd0;
          fStack_fec = uStack_1440._4_4_ - fStack_fcc;
          fVar334 = *(float *)(local_1208 + k * 4 + 0x50);
          local_1498._4_4_ = fVar334;
          local_1498._0_4_ = fVar334;
          local_14d8._4_4_ = *(undefined4 *)(local_1208 + k * 4 + 0x60);
          local_14d8._0_4_ = local_14d8._4_4_;
          fStack_14d0 = (float)local_14d8._4_4_;
          fStack_14cc = (float)local_14d8._4_4_;
          fStack_144c = *(float *)(local_1208 + k * 4 + 0x40);
          fVar259 = (local_1008 * ((float)local_1448 + local_fd8) -
                    (fVar295 + local_fc8) * local_ff8) * fStack_144c +
                    ((fVar217 + fVar258) * local_ff8 - ((float)local_1448 + local_fd8) * local_fe8)
                    * fVar334 +
                    (local_fe8 * (fVar295 + local_fc8) - (fVar217 + fVar258) * local_1008) *
                    (float)local_14d8._4_4_;
          fVar215 = (fStack_1004 * (local_1448._4_4_ + fStack_fd4) -
                    (fVar296 + fStack_fc4) * fStack_ff4) * fStack_144c +
                    ((fVar289 + fVar214) * fStack_ff4 - (local_1448._4_4_ + fStack_fd4) * fStack_fe4
                    ) * fVar334 +
                    (fStack_fe4 * (fVar296 + fStack_fc4) - (fVar289 + fVar214) * fStack_1004) *
                    (float)local_14d8._4_4_;
          local_1028._0_8_ = CONCAT44(fVar215,fVar259);
          local_1028._8_4_ =
               (fStack_1000 * ((float)uStack_1440 + fStack_fd0) -
               (fVar297 + fStack_fc0) * fStack_ff0) * fStack_144c +
               ((fVar240 + fVar288) * fStack_ff0 - ((float)uStack_1440 + fStack_fd0) * fStack_fe0) *
               fVar334 + (fStack_fe0 * (fVar297 + fStack_fc0) - (fVar240 + fVar288) * fStack_1000) *
                         (float)local_14d8._4_4_;
          local_1028._12_4_ =
               (fStack_ffc * (uStack_1440._4_4_ + fStack_fcc) - (fVar307 + fStack_fbc) * fStack_fec)
               * fStack_144c +
               ((fVar168 + fVar216) * fStack_fec - (uStack_1440._4_4_ + fStack_fcc) * fStack_fdc) *
               fVar334 + (fStack_fdc * (fVar307 + fStack_fbc) - (fVar168 + fVar216) * fStack_ffc) *
                         (float)local_14d8._4_4_;
          fStack_1080 = fVar305;
          fStack_107c = fVar363;
          fVar327 = local_1088 - fVar169;
          fVar330 = fStack_1084 - fVar169;
          fVar331 = fVar305 - fVar169;
          fVar294 = fVar363 - fVar169;
          local_1078 = CONCAT44(fVar323,fVar325);
          _local_1068 = CONCAT44(fVar320,fVar306);
          fVar325 = fVar325 - fVar326;
          fVar323 = fVar323 - fVar326;
          fVar293 = fVar306 - fVar326;
          fVar360 = fVar320 - fVar326;
          fVar308 = fVar258 - fVar321;
          fVar310 = fVar214 - fVar322;
          fVar311 = fVar288 - fVar324;
          fVar313 = fVar216 - fVar298;
          fVar364 = local_fc8 - fVar327;
          fVar366 = fStack_fc4 - fVar330;
          fVar368 = fStack_fc0 - fVar331;
          fVar371 = fStack_fbc - fVar294;
          local_1018 = local_fd8 - fVar325;
          fStack_1014 = fStack_fd4 - fVar323;
          fStack_1010 = fStack_fd0 - fVar293;
          fStack_100c = fStack_fcc - fVar360;
          local_1038._0_4_ =
               (fVar364 * (local_fd8 + fVar325) - (local_fc8 + fVar327) * local_1018) * fStack_144c
               + ((fVar258 + fVar321) * local_1018 - (local_fd8 + fVar325) * fVar308) * fVar334 +
                 (fVar308 * (local_fc8 + fVar327) - (fVar258 + fVar321) * fVar364) *
                 (float)local_14d8._4_4_;
          local_1038._4_4_ =
               (fVar366 * (fStack_fd4 + fVar323) - (fStack_fc4 + fVar330) * fStack_1014) *
               fStack_144c +
               ((fVar214 + fVar322) * fStack_1014 - (fStack_fd4 + fVar323) * fVar310) * fVar334 +
               (fVar310 * (fStack_fc4 + fVar330) - (fVar214 + fVar322) * fVar366) *
               (float)local_14d8._4_4_;
          local_1038._8_4_ =
               (fVar368 * (fStack_fd0 + fVar293) - (fStack_fc0 + fVar331) * fStack_1010) *
               fStack_144c +
               ((fVar288 + fVar324) * fStack_1010 - (fStack_fd0 + fVar293) * fVar311) * fVar334 +
               (fVar311 * (fStack_fc0 + fVar331) - (fVar288 + fVar324) * fVar368) *
               (float)local_14d8._4_4_;
          local_1038._12_4_ =
               (fVar371 * (fStack_fcc + fVar360) - (fStack_fbc + fVar294) * fStack_100c) *
               fStack_144c +
               ((fVar216 + fVar298) * fStack_100c - (fStack_fcc + fVar360) * fVar313) * fVar334 +
               (fVar313 * (fStack_fbc + fVar294) - (fVar216 + fVar298) * fVar371) *
               (float)local_14d8._4_4_;
          fVar361 = fVar321 - fVar217;
          fVar315 = fVar322 - fVar289;
          fVar317 = fVar324 - fVar240;
          fVar318 = fVar298 - fVar168;
          fVar335 = fVar327 - fVar295;
          fVar349 = fVar330 - fVar296;
          fVar357 = fVar331 - fVar297;
          fVar358 = fVar294 - fVar307;
          fVar309 = fVar325 - (float)local_1448;
          fVar312 = fVar323 - local_1448._4_4_;
          fVar314 = fVar293 - (float)uStack_1440;
          fVar316 = fVar360 - uStack_1440._4_4_;
          local_1388 = fVar327 + fVar295;
          fStack_1384 = fVar330 + fVar296;
          fStack_1380 = fVar331 + fVar297;
          fStack_137c = fVar294 + fVar307;
          uStack_1490._0_4_ = fVar334;
          uStack_1490._4_4_ = fVar334;
          local_1378 = fVar325 + (float)local_1448;
          fStack_1374 = fVar323 + local_1448._4_4_;
          fStack_1370 = fVar293 + (float)uStack_1440;
          fStack_136c = fVar360 + uStack_1440._4_4_;
          auVar177._0_4_ =
               (fVar335 * local_1378 - local_1388 * fVar309) * fStack_144c +
               ((fVar217 + fVar321) * fVar309 - fVar361 * local_1378) * fVar334 +
               (fVar361 * local_1388 - (fVar217 + fVar321) * fVar335) * (float)local_14d8._4_4_;
          auVar177._4_4_ =
               (fVar349 * fStack_1374 - fStack_1384 * fVar312) * fStack_144c +
               ((fVar289 + fVar322) * fVar312 - fVar315 * fStack_1374) * fVar334 +
               (fVar315 * fStack_1384 - (fVar289 + fVar322) * fVar349) * (float)local_14d8._4_4_;
          auVar177._8_4_ =
               (fVar357 * fStack_1370 - fStack_1380 * fVar314) * fStack_144c +
               ((fVar240 + fVar324) * fVar314 - fVar317 * fStack_1370) * fVar334 +
               (fVar317 * fStack_1380 - (fVar240 + fVar324) * fVar357) * (float)local_14d8._4_4_;
          auVar177._12_4_ =
               (fVar358 * fStack_136c - fStack_137c * fVar316) * fStack_144c +
               ((fVar168 + fVar298) * fVar316 - fVar318 * fStack_136c) * fVar334 +
               (fVar318 * fStack_137c - (fVar168 + fVar298) * fVar358) * (float)local_14d8._4_4_;
          local_1048 = fVar259 + local_1038._0_4_ + auVar177._0_4_;
          fStack_1044 = fVar215 + local_1038._4_4_ + auVar177._4_4_;
          fStack_1040 = local_1028._8_4_ + local_1038._8_4_ + auVar177._8_4_;
          fStack_103c = local_1028._12_4_ + local_1038._12_4_ + auVar177._12_4_;
          auVar281._8_4_ = local_1028._8_4_;
          auVar281._0_8_ = local_1028._0_8_;
          auVar281._12_4_ = local_1028._12_4_;
          auVar173 = minps(auVar281,local_1038);
          auVar173 = minps(auVar173,auVar177);
          auVar328._8_4_ = local_1028._8_4_;
          auVar328._0_8_ = local_1028._0_8_;
          auVar328._12_4_ = local_1028._12_4_;
          auVar222 = maxps(auVar328,local_1038);
          auVar222 = maxps(auVar222,auVar177);
          fVar168 = ABS(local_1048);
          fVar217 = ABS(fStack_1044);
          fVar289 = ABS(fStack_1040);
          fVar240 = ABS(fStack_103c);
          auVar329._4_4_ = -(uint)(auVar222._4_4_ <= fVar217 * 1.1920929e-07);
          auVar329._0_4_ = -(uint)(auVar222._0_4_ <= fVar168 * 1.1920929e-07);
          auVar329._8_4_ = -(uint)(auVar222._8_4_ <= fVar289 * 1.1920929e-07);
          auVar329._12_4_ = -(uint)(auVar222._12_4_ <= fVar240 * 1.1920929e-07);
          auVar282._4_4_ = -(uint)(-(fVar217 * 1.1920929e-07) <= auVar173._4_4_);
          auVar282._0_4_ = -(uint)(-(fVar168 * 1.1920929e-07) <= auVar173._0_4_);
          auVar282._8_4_ = -(uint)(-(fVar289 * 1.1920929e-07) <= auVar173._8_4_);
          auVar282._12_4_ = -(uint)(-(fVar240 * 1.1920929e-07) <= auVar173._12_4_);
          auVar329 = auVar329 | auVar282;
          iVar135 = movmskps((int)lVar22,auVar329);
          sy.field_0.i[1] = auVar64._4_4_;
          sx.field_0.i[1] = sx.field_0.i[0];
          sx.field_0.i[2] = sx.field_0.i[0];
          sx.field_0.i[3] = sx.field_0.i[0];
          uVar141 = (uint)local_11f0;
          local_1188 = ZEXT416(uVar141);
          local_1198 = ZEXT416((uint)local_1410);
          if (iVar135 != 0) {
            local_1058 = fVar168;
            fStack_1054 = fVar217;
            fStack_1050 = fVar289;
            fStack_104c = fVar240;
            uVar156 = -(uint)(ABS(fVar335 * local_1018) <= ABS(fVar364 * local_ff8));
            uVar159 = -(uint)(ABS(fVar349 * fStack_1014) <= ABS(fVar366 * fStack_ff4));
            uVar162 = -(uint)(ABS(fVar357 * fStack_1010) <= ABS(fVar368 * fStack_ff0));
            uVar165 = -(uint)(ABS(fVar358 * fStack_100c) <= ABS(fVar371 * fStack_fec));
            uVar157 = -(uint)(ABS(fVar308 * fVar309) <= ABS(local_fe8 * local_1018));
            uVar160 = -(uint)(ABS(fVar310 * fVar312) <= ABS(fStack_fe4 * fStack_1014));
            uVar163 = -(uint)(ABS(fVar311 * fVar314) <= ABS(fStack_fe0 * fStack_1010));
            uVar166 = -(uint)(ABS(fVar313 * fVar316) <= ABS(fStack_fdc * fStack_100c));
            uVar158 = -(uint)(ABS(fVar361 * fVar364) <= ABS(fVar308 * local_1008));
            uVar161 = -(uint)(ABS(fVar315 * fVar366) <= ABS(fVar310 * fStack_1004));
            uVar164 = -(uint)(ABS(fVar317 * fVar368) <= ABS(fVar311 * fStack_1000));
            uVar167 = -(uint)(ABS(fVar318 * fVar371) <= ABS(fVar313 * fStack_ffc));
            fVar321 = (float)(~uVar156 & (uint)(local_1008 * local_1018 - fVar364 * local_ff8) |
                             (uint)(fVar364 * fVar309 - fVar335 * local_1018) & uVar156);
            fVar322 = (float)(~uVar159 & (uint)(fStack_1004 * fStack_1014 - fVar366 * fStack_ff4) |
                             (uint)(fVar366 * fVar312 - fVar349 * fStack_1014) & uVar159);
            fVar324 = (float)(~uVar162 & (uint)(fStack_1000 * fStack_1010 - fVar368 * fStack_ff0) |
                             (uint)(fVar368 * fVar314 - fVar357 * fStack_1010) & uVar162);
            fVar298 = (float)(~uVar165 & (uint)(fStack_ffc * fStack_100c - fVar371 * fStack_fec) |
                             (uint)(fVar371 * fVar316 - fVar358 * fStack_100c) & uVar165);
            auVar272._0_4_ = (uint)(fVar361 * local_1018 - fVar308 * fVar309) & uVar157;
            auVar272._4_4_ = (uint)(fVar315 * fStack_1014 - fVar310 * fVar312) & uVar160;
            auVar272._8_4_ = (uint)(fVar317 * fStack_1010 - fVar311 * fVar314) & uVar163;
            auVar272._12_4_ = (uint)(fVar318 * fStack_100c - fVar313 * fVar316) & uVar166;
            auVar283._0_4_ = ~uVar157 & (uint)(local_ff8 * fVar308 - local_fe8 * local_1018);
            auVar283._4_4_ = ~uVar160 & (uint)(fStack_ff4 * fVar310 - fStack_fe4 * fStack_1014);
            auVar283._8_4_ = ~uVar163 & (uint)(fStack_ff0 * fVar311 - fStack_fe0 * fStack_1010);
            auVar283._12_4_ = ~uVar166 & (uint)(fStack_fec * fVar313 - fStack_fdc * fStack_100c);
            auVar283 = auVar283 | auVar272;
            fVar361 = (float)(~uVar158 & (uint)(local_fe8 * fVar364 - fVar308 * local_1008) |
                             (uint)(fVar308 * fVar335 - fVar361 * fVar364) & uVar158);
            fVar315 = (float)(~uVar161 & (uint)(fStack_fe4 * fVar366 - fVar310 * fStack_1004) |
                             (uint)(fVar310 * fVar349 - fVar315 * fVar366) & uVar161);
            fVar317 = (float)(~uVar164 & (uint)(fStack_fe0 * fVar368 - fVar311 * fStack_1000) |
                             (uint)(fVar311 * fVar357 - fVar317 * fVar368) & uVar164);
            fVar318 = (float)(~uVar167 & (uint)(fStack_fdc * fVar371 - fVar313 * fStack_ffc) |
                             (uint)(fVar313 * fVar358 - fVar318 * fVar371) & uVar167);
            fVar308 = fStack_144c * fVar321 +
                      fVar334 * auVar283._0_4_ + (float)local_14d8._4_4_ * fVar361;
            fVar310 = fStack_144c * fVar322 +
                      fVar334 * auVar283._4_4_ + (float)local_14d8._4_4_ * fVar315;
            fVar311 = fStack_144c * fVar324 +
                      fVar334 * auVar283._8_4_ + (float)local_14d8._4_4_ * fVar317;
            fVar313 = fStack_144c * fVar298 +
                      fVar334 * auVar283._12_4_ + (float)local_14d8._4_4_ * fVar318;
            auVar250._0_4_ = fVar308 + fVar308;
            auVar250._4_4_ = fVar310 + fVar310;
            auVar250._8_4_ = fVar311 + fVar311;
            auVar250._12_4_ = fVar313 + fVar313;
            auVar178._0_4_ = local_fc8 * auVar283._0_4_ + local_fd8 * fVar361;
            auVar178._4_4_ = fStack_fc4 * auVar283._4_4_ + fStack_fd4 * fVar315;
            auVar178._8_4_ = fStack_fc0 * auVar283._8_4_ + fStack_fd0 * fVar317;
            auVar178._12_4_ = fStack_fbc * auVar283._12_4_ + fStack_fcc * fVar318;
            fVar308 = fVar258 * fVar321 + auVar178._0_4_;
            fVar310 = fVar214 * fVar322 + auVar178._4_4_;
            fVar311 = fVar288 * fVar324 + auVar178._8_4_;
            fVar313 = fVar216 * fVar298 + auVar178._12_4_;
            auVar173 = rcpps(auVar178,auVar250);
            fVar258 = auVar173._0_4_;
            fVar214 = auVar173._4_4_;
            fVar288 = auVar173._8_4_;
            fVar216 = auVar173._12_4_;
            fVar308 = ((1.0 - auVar250._0_4_ * fVar258) * fVar258 + fVar258) * (fVar308 + fVar308);
            fVar214 = ((1.0 - auVar250._4_4_ * fVar214) * fVar214 + fVar214) * (fVar310 + fVar310);
            fVar288 = ((1.0 - auVar250._8_4_ * fVar288) * fVar288 + fVar288) * (fVar311 + fVar311);
            fVar216 = ((1.0 - auVar250._12_4_ * fVar216) * fVar216 + fVar216) * (fVar313 + fVar313);
            fVar258 = *(float *)(local_1208 + k * 4 + 0x30);
            auVar179._0_4_ =
                 -(uint)(fVar308 <= (float)local_fb8._0_4_ && fVar258 <= fVar308) & auVar329._0_4_;
            auVar179._4_4_ =
                 -(uint)(fVar214 <= (float)local_fb8._0_4_ && fVar258 <= fVar214) & auVar329._4_4_;
            auVar179._8_4_ =
                 -(uint)(fVar288 <= (float)local_fb8._0_4_ && fVar258 <= fVar288) & auVar329._8_4_;
            auVar179._12_4_ =
                 -(uint)(fVar216 <= (float)local_fb8._0_4_ && fVar258 <= fVar216) & auVar329._12_4_;
            iVar135 = movmskps(uVar144,auVar179);
            if (iVar135 != 0) {
              aVar180._0_4_ = auVar179._0_4_ & -(uint)(auVar250._0_4_ != 0.0);
              aVar180._4_4_ = auVar179._4_4_ & -(uint)(auVar250._4_4_ != 0.0);
              aVar180._8_4_ = auVar179._8_4_ & -(uint)(auVar250._8_4_ != 0.0);
              aVar180._12_4_ = auVar179._12_4_ & -(uint)(auVar250._12_4_ != 0.0);
              iVar135 = movmskps(iVar135,(undefined1  [16])aVar180);
              if (iVar135 != 0) {
                auVar89._4_4_ = fStack_1044;
                auVar89._0_4_ = local_1048;
                auVar89._8_4_ = fStack_1040;
                auVar89._12_4_ = fStack_103c;
                local_12e8._4_4_ = fVar214;
                local_12e8._0_4_ = fVar308;
                fStack_12e0 = fVar288;
                fStack_12dc = fVar216;
                local_12d8[0] = fVar321;
                local_12d8[1] = fVar322;
                local_12d8[2] = fVar324;
                local_12d8[3] = fVar298;
                _local_12c8 = auVar283;
                local_12b8[0] = fVar361;
                local_12b8[1] = fVar315;
                local_12b8[2] = fVar317;
                local_12b8[3] = fVar318;
                auVar273._4_12_ = auVar272._4_12_;
                auVar273._0_4_ = (float)(int)(*(ushort *)(lVar19 + 8 + lVar154) - 1);
                auVar291._4_4_ = auVar272._4_4_;
                auVar291._0_4_ = auVar273._0_4_;
                auVar291._8_4_ = auVar272._8_4_;
                auVar291._12_4_ = auVar272._12_4_;
                auVar173 = rcpss(auVar291,auVar273);
                auVar301._4_12_ = local_1498._4_12_;
                auVar301._0_4_ = (float)(int)(*(ushort *)(lVar19 + 10 + lVar154) - 1);
                fVar258 = (2.0 - auVar273._0_4_ * auVar173._0_4_) * auVar173._0_4_;
                auVar292._4_4_ = fVar334;
                auVar292._0_4_ = auVar301._0_4_;
                auVar292._8_4_ = fVar334;
                auVar292._12_4_ = fVar334;
                auVar173 = rcpss(auVar292,auVar301);
                fVar334 = (2.0 - auVar301._0_4_ * auVar173._0_4_) * auVar173._0_4_;
                tNear.field_0.v[0] = fVar258 * (fVar259 + (float)sx.field_0.i[0] * local_1048);
                tNear.field_0.v[1] =
                     fVar258 * (fVar215 + (float)(sx.field_0.i[0] + 1) * fStack_1044);
                tNear.field_0.v[2] =
                     fVar258 * (local_1028._8_4_ + (float)(sx.field_0.i[0] + 1) * fStack_1040);
                tNear.field_0.v[3] =
                     fVar258 * (local_1028._12_4_ + (float)sx.field_0.i[0] * fStack_103c);
                auVar265._0_4_ = (float)sy.field_0.i[1] * local_1048 + local_1038._0_4_;
                auVar265._4_4_ = (float)sy.field_0.i[1] * fStack_1044 + local_1038._4_4_;
                auVar265._8_4_ = (float)(sy.field_0.i[1] + 1) * fStack_1040 + local_1038._8_4_;
                auVar265._12_4_ = (float)(sy.field_0.i[1] + 1) * fStack_103c + local_1038._12_4_;
                pGVar18 = (local_11f8->geometries).items[local_11f0].ptr;
                if ((pGVar18->mask & *(uint *)(local_1208 + k * 4 + 0x90)) != 0) {
                  auVar173 = rcpps(auVar265,auVar89);
                  fVar258 = auVar173._0_4_;
                  fVar259 = auVar173._4_4_;
                  fVar215 = auVar173._8_4_;
                  fVar310 = auVar173._12_4_;
                  fVar168 = (float)(-(uint)(1e-18 <= fVar168) &
                                   (uint)(((float)DAT_01f46a60 - local_1048 * fVar258) * fVar258 +
                                         fVar258));
                  fVar258 = (float)(-(uint)(1e-18 <= fVar217) &
                                   (uint)((DAT_01f46a60._4_4_ - fStack_1044 * fVar259) * fVar259 +
                                         fVar259));
                  fVar259 = (float)(-(uint)(1e-18 <= fVar289) &
                                   (uint)((DAT_01f46a60._8_4_ - fStack_1040 * fVar215) * fVar215 +
                                         fVar215));
                  fVar215 = (float)(-(uint)(1e-18 <= fVar240) &
                                   (uint)((DAT_01f46a60._12_4_ - fStack_103c * fVar310) * fVar310 +
                                         fVar310));
                  auVar251._0_4_ = tNear.field_0.v[0] * fVar168;
                  auVar251._4_4_ = tNear.field_0.v[1] * fVar258;
                  auVar251._8_4_ = tNear.field_0.v[2] * fVar259;
                  auVar251._12_4_ = tNear.field_0.v[3] * fVar215;
                  local_1308 = minps(auVar251,_DAT_01f46a60);
                  auVar274._0_4_ = fVar334 * auVar265._0_4_ * fVar168;
                  auVar274._4_4_ = fVar334 * auVar265._4_4_ * fVar258;
                  auVar274._8_4_ = fVar334 * auVar265._8_4_ * fVar259;
                  auVar274._12_4_ = fVar334 * auVar265._12_4_ * fVar215;
                  local_12f8 = minps(auVar274,_DAT_01f46a60);
                  auVar197._0_4_ = (uint)fVar308 & aVar180._0_4_;
                  auVar197._4_4_ = (uint)fVar214 & aVar180._4_4_;
                  auVar197._8_4_ = (uint)fVar288 & aVar180._8_4_;
                  auVar197._12_4_ = (uint)fVar216 & aVar180._12_4_;
                  auVar224._0_8_ = CONCAT44(~aVar180._4_4_,~aVar180._0_4_) & 0x7f8000007f800000;
                  auVar224._8_4_ = ~aVar180._8_4_ & 0x7f800000;
                  auVar224._12_4_ = ~aVar180._12_4_ & 0x7f800000;
                  auVar224 = auVar224 | auVar197;
                  auVar252._4_4_ = auVar224._0_4_;
                  auVar252._0_4_ = auVar224._4_4_;
                  auVar252._8_4_ = auVar224._12_4_;
                  auVar252._12_4_ = auVar224._8_4_;
                  auVar173 = minps(auVar252,auVar224);
                  auVar198._0_8_ = auVar173._8_8_;
                  auVar198._8_4_ = auVar173._0_4_;
                  auVar198._12_4_ = auVar173._4_4_;
                  auVar173 = minps(auVar198,auVar173);
                  uVar160 = -(uint)(auVar173._0_4_ == auVar224._0_4_);
                  uVar161 = -(uint)(auVar173._4_4_ == auVar224._4_4_);
                  uVar162 = -(uint)(auVar173._8_4_ == auVar224._8_4_);
                  uVar163 = -(uint)(auVar173._12_4_ == auVar224._12_4_);
                  auVar225._0_4_ = uVar160 & aVar180._0_4_;
                  auVar225._4_4_ = uVar161 & aVar180._4_4_;
                  auVar225._8_4_ = uVar162 & aVar180._8_4_;
                  auVar225._12_4_ = uVar163 & aVar180._12_4_;
                  iVar135 = movmskps(*(uint *)(local_1208 + k * 4 + 0x90),auVar225);
                  uVar156 = 0xffffffff;
                  uVar157 = 0xffffffff;
                  uVar158 = 0xffffffff;
                  uVar159 = 0xffffffff;
                  if (iVar135 != 0) {
                    uVar156 = uVar160;
                    uVar157 = uVar161;
                    uVar158 = uVar162;
                    uVar159 = uVar163;
                  }
                  auVar181._0_4_ = aVar180._0_4_ & uVar156;
                  auVar181._4_4_ = aVar180._4_4_ & uVar157;
                  auVar181._8_4_ = aVar180._8_4_ & uVar158;
                  auVar181._12_4_ = aVar180._12_4_ & uVar159;
                  uVar156 = movmskps(iVar135,auVar181);
                  lVar138 = 0;
                  if (uVar156 != 0) {
                    for (; (uVar156 >> lVar138 & 1) == 0; lVar138 = lVar138 + 1) {
                    }
                  }
                  valid.field_0 = aVar180;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar18->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar143 = *(undefined4 *)(local_1308 + lVar138 * 4);
                    uVar15 = *(undefined4 *)(local_12f8 + lVar138 * 4);
                    fVar168 = local_12d8[lVar138];
                    fVar334 = local_12b8[lVar138 + -4];
                    fVar258 = local_12b8[lVar138];
                    *(float *)(local_1208 + k * 4 + 0x80) = local_12d8[lVar138 + -4];
                    *(float *)(local_1208 + k * 4 + 0xc0) = fVar168;
                    *(float *)(local_1208 + k * 4 + 0xd0) = fVar334;
                    *(float *)(local_1208 + k * 4 + 0xe0) = fVar258;
                    *(undefined4 *)(local_1208 + k * 4 + 0xf0) = uVar143;
                    *(undefined4 *)(local_1208 + k * 4 + 0x100) = uVar15;
                    *(uint *)(local_1208 + k * 4 + 0x110) = (uint)local_1410;
                    *(uint *)(local_1208 + k * 4 + 0x120) = uVar141;
                    *(uint *)(local_1208 + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(local_1208 + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_1498._4_4_ = uVar141;
                    local_1498._0_4_ = uVar141;
                    uStack_1490._0_4_ = (float)uVar141;
                    uStack_1490._4_4_ = (float)uVar141;
                    local_1448 = CONCAT44((uint)local_1410,(uint)local_1410);
                    uStack_1440._0_4_ = (float)(uint)local_1410;
                    uStack_1440._4_4_ = (float)(uint)local_1410;
                    auVar116 = *(undefined1 (*) [12])(mm_lookupmask_ps + lVar136);
                    fStack_144c = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar136 + 8) >>
                                         0x20);
                    _local_14d8 = ZEXT416(*(uint *)(local_1208 + k * 4 + 0x80));
                    while( true ) {
                      local_1128 = *(undefined4 *)(local_1308 + lVar138 * 4);
                      local_1118._4_4_ = *(undefined4 *)(local_12f8 + lVar138 * 4);
                      *(float *)(ray + k * 4 + 0x80) = local_12d8[lVar138 + -4];
                      args.context = context->user;
                      local_1158 = local_12d8[lVar138];
                      local_1148._4_4_ = local_12b8[lVar138 + -4];
                      local_1138._4_4_ = local_12b8[lVar138];
                      fStack_1154 = local_1158;
                      fStack_1150 = local_1158;
                      fStack_114c = local_1158;
                      local_1148._0_4_ = local_1148._4_4_;
                      fStack_1140 = (float)local_1148._4_4_;
                      fStack_113c = (float)local_1148._4_4_;
                      local_1138._0_4_ = local_1138._4_4_;
                      fStack_1130 = (float)local_1138._4_4_;
                      fStack_112c = (float)local_1138._4_4_;
                      uStack_1124 = local_1128;
                      uStack_1120 = local_1128;
                      uStack_111c = local_1128;
                      local_1118._0_4_ = local_1118._4_4_;
                      local_1118._8_4_ = local_1118._4_4_;
                      local_1118._12_4_ = local_1118._4_4_;
                      local_1108 = local_1448;
                      uStack_1100 = uStack_1440;
                      local_10f8 = local_1498;
                      uStack_10f0 = uStack_1490;
                      local_10e8 = (args.context)->instID[0];
                      uStack_10e4 = local_10e8;
                      uStack_10e0 = local_10e8;
                      uStack_10dc = local_10e8;
                      local_10d8 = (args.context)->instPrimID[0];
                      uStack_10d4 = local_10d8;
                      uStack_10d0 = local_10d8;
                      uStack_10cc = local_10d8;
                      local_1428._12_4_ = fStack_144c;
                      local_1428._0_12_ = auVar116;
                      args.valid = (int *)local_1428;
                      args.geometryUserPtr = pGVar18->userPtr;
                      args.ray = (RTCRayN *)ray;
                      args.hit = (RTCHitN *)&local_1158;
                      args.N = 4;
                      p_Var140 = pGVar18->intersectionFilterN;
                      if (p_Var140 != (RTCFilterFunctionN)0x0) {
                        p_Var140 = (RTCFilterFunctionN)(*p_Var140)(&args);
                      }
                      auVar199._0_4_ = -(uint)(local_1428._0_4_ == 0);
                      auVar199._4_4_ = -(uint)(local_1428._4_4_ == 0);
                      auVar199._8_4_ = -(uint)(local_1428._8_4_ == 0);
                      auVar199._12_4_ = -(uint)(local_1428._12_4_ == 0);
                      uVar156 = movmskps((int)p_Var140,auVar199);
                      pRVar139 = (RTCRayN *)(ulong)(uVar156 ^ 0xf);
                      if ((uVar156 ^ 0xf) == 0) {
                        auVar199 = auVar199 ^ _DAT_01f46b70;
                      }
                      else {
                        p_Var140 = context->args->filter;
                        if ((p_Var140 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar18->field_8).field_0x2 & 0x40) != 0)))) {
                          p_Var140 = (RTCFilterFunctionN)(*p_Var140)(&args);
                        }
                        auVar182._0_4_ = -(uint)(local_1428._0_4_ == 0);
                        auVar182._4_4_ = -(uint)(local_1428._4_4_ == 0);
                        auVar182._8_4_ = -(uint)(local_1428._8_4_ == 0);
                        auVar182._12_4_ = -(uint)(local_1428._12_4_ == 0);
                        auVar199 = auVar182 ^ _DAT_01f46b70;
                        uVar156 = movmskps((int)p_Var140,auVar182);
                        pRVar139 = (RTCRayN *)(ulong)(uVar156 ^ 0xf);
                        if ((uVar156 ^ 0xf) != 0) {
                          uVar156 = *(uint *)(args.hit + 4);
                          uVar157 = *(uint *)(args.hit + 8);
                          uVar158 = *(uint *)(args.hit + 0xc);
                          *(uint *)(args.ray + 0xc0) =
                               ~auVar182._0_4_ & *(uint *)args.hit |
                               *(uint *)(args.ray + 0xc0) & auVar182._0_4_;
                          *(uint *)(args.ray + 0xc4) =
                               ~auVar182._4_4_ & uVar156 |
                               *(uint *)(args.ray + 0xc4) & auVar182._4_4_;
                          *(uint *)(args.ray + 200) =
                               ~auVar182._8_4_ & uVar157 |
                               *(uint *)(args.ray + 200) & auVar182._8_4_;
                          *(uint *)(args.ray + 0xcc) =
                               ~auVar182._12_4_ & uVar158 |
                               *(uint *)(args.ray + 0xcc) & auVar182._12_4_;
                          uVar156 = *(uint *)(args.hit + 0x14);
                          uVar157 = *(uint *)(args.hit + 0x18);
                          uVar158 = *(uint *)(args.hit + 0x1c);
                          *(uint *)(args.ray + 0xd0) =
                               ~auVar182._0_4_ & *(uint *)(args.hit + 0x10) |
                               *(uint *)(args.ray + 0xd0) & auVar182._0_4_;
                          *(uint *)(args.ray + 0xd4) =
                               ~auVar182._4_4_ & uVar156 |
                               *(uint *)(args.ray + 0xd4) & auVar182._4_4_;
                          *(uint *)(args.ray + 0xd8) =
                               ~auVar182._8_4_ & uVar157 |
                               *(uint *)(args.ray + 0xd8) & auVar182._8_4_;
                          *(uint *)(args.ray + 0xdc) =
                               ~auVar182._12_4_ & uVar158 |
                               *(uint *)(args.ray + 0xdc) & auVar182._12_4_;
                          uVar156 = *(uint *)(args.hit + 0x24);
                          uVar157 = *(uint *)(args.hit + 0x28);
                          uVar158 = *(uint *)(args.hit + 0x2c);
                          *(uint *)(args.ray + 0xe0) =
                               ~auVar182._0_4_ & *(uint *)(args.hit + 0x20) |
                               *(uint *)(args.ray + 0xe0) & auVar182._0_4_;
                          *(uint *)(args.ray + 0xe4) =
                               ~auVar182._4_4_ & uVar156 |
                               *(uint *)(args.ray + 0xe4) & auVar182._4_4_;
                          *(uint *)(args.ray + 0xe8) =
                               ~auVar182._8_4_ & uVar157 |
                               *(uint *)(args.ray + 0xe8) & auVar182._8_4_;
                          *(uint *)(args.ray + 0xec) =
                               ~auVar182._12_4_ & uVar158 |
                               *(uint *)(args.ray + 0xec) & auVar182._12_4_;
                          auVar275._0_4_ = *(uint *)(args.ray + 0xf0) & auVar182._0_4_;
                          auVar275._4_4_ = *(uint *)(args.ray + 0xf4) & auVar182._4_4_;
                          auVar275._8_4_ = *(uint *)(args.ray + 0xf8) & auVar182._8_4_;
                          auVar275._12_4_ = *(uint *)(args.ray + 0xfc) & auVar182._12_4_;
                          auVar226._0_4_ = ~auVar182._0_4_ & *(uint *)(args.hit + 0x30);
                          auVar226._4_4_ = ~auVar182._4_4_ & *(uint *)(args.hit + 0x34);
                          auVar226._8_4_ = ~auVar182._8_4_ & *(uint *)(args.hit + 0x38);
                          auVar226._12_4_ = ~auVar182._12_4_ & *(uint *)(args.hit + 0x3c);
                          *(undefined1 (*) [16])(args.ray + 0xf0) = auVar226 | auVar275;
                          uVar156 = *(uint *)(args.hit + 0x44);
                          uVar157 = *(uint *)(args.hit + 0x48);
                          uVar158 = *(uint *)(args.hit + 0x4c);
                          *(uint *)(args.ray + 0x100) =
                               ~auVar182._0_4_ & *(uint *)(args.hit + 0x40) |
                               *(uint *)(args.ray + 0x100) & auVar182._0_4_;
                          *(uint *)(args.ray + 0x104) =
                               ~auVar182._4_4_ & uVar156 |
                               *(uint *)(args.ray + 0x104) & auVar182._4_4_;
                          *(uint *)(args.ray + 0x108) =
                               ~auVar182._8_4_ & uVar157 |
                               *(uint *)(args.ray + 0x108) & auVar182._8_4_;
                          *(uint *)(args.ray + 0x10c) =
                               ~auVar182._12_4_ & uVar158 |
                               *(uint *)(args.ray + 0x10c) & auVar182._12_4_;
                          uVar156 = *(uint *)(args.hit + 0x54);
                          uVar157 = *(uint *)(args.hit + 0x58);
                          uVar158 = *(uint *)(args.hit + 0x5c);
                          *(uint *)(args.ray + 0x110) =
                               *(uint *)(args.ray + 0x110) & auVar182._0_4_ |
                               ~auVar182._0_4_ & *(uint *)(args.hit + 0x50);
                          *(uint *)(args.ray + 0x114) =
                               *(uint *)(args.ray + 0x114) & auVar182._4_4_ |
                               ~auVar182._4_4_ & uVar156;
                          *(uint *)(args.ray + 0x118) =
                               *(uint *)(args.ray + 0x118) & auVar182._8_4_ |
                               ~auVar182._8_4_ & uVar157;
                          *(uint *)(args.ray + 0x11c) =
                               *(uint *)(args.ray + 0x11c) & auVar182._12_4_ |
                               ~auVar182._12_4_ & uVar158;
                          uVar156 = *(uint *)(args.hit + 100);
                          uVar157 = *(uint *)(args.hit + 0x68);
                          uVar158 = *(uint *)(args.hit + 0x6c);
                          *(uint *)(args.ray + 0x120) =
                               *(uint *)(args.ray + 0x120) & auVar182._0_4_ |
                               ~auVar182._0_4_ & *(uint *)(args.hit + 0x60);
                          *(uint *)(args.ray + 0x124) =
                               *(uint *)(args.ray + 0x124) & auVar182._4_4_ |
                               ~auVar182._4_4_ & uVar156;
                          *(uint *)(args.ray + 0x128) =
                               *(uint *)(args.ray + 0x128) & auVar182._8_4_ |
                               ~auVar182._8_4_ & uVar157;
                          *(uint *)(args.ray + 300) =
                               *(uint *)(args.ray + 300) & auVar182._12_4_ |
                               ~auVar182._12_4_ & uVar158;
                          uVar156 = *(uint *)(args.hit + 0x74);
                          uVar157 = *(uint *)(args.hit + 0x78);
                          uVar158 = *(uint *)(args.hit + 0x7c);
                          *(uint *)(args.ray + 0x130) =
                               ~auVar182._0_4_ & *(uint *)(args.hit + 0x70) |
                               *(uint *)(args.ray + 0x130) & auVar182._0_4_;
                          *(uint *)(args.ray + 0x134) =
                               ~auVar182._4_4_ & uVar156 |
                               *(uint *)(args.ray + 0x134) & auVar182._4_4_;
                          *(uint *)(args.ray + 0x138) =
                               ~auVar182._8_4_ & uVar157 |
                               *(uint *)(args.ray + 0x138) & auVar182._8_4_;
                          *(uint *)(args.ray + 0x13c) =
                               ~auVar182._12_4_ & uVar158 |
                               *(uint *)(args.ray + 0x13c) & auVar182._12_4_;
                          *(undefined1 (*) [16])(args.ray + 0x140) =
                               ~auVar182 & *(undefined1 (*) [16])(args.hit + 0x80) |
                               *(undefined1 (*) [16])(args.ray + 0x140) & auVar182;
                          pRVar139 = args.ray;
                        }
                      }
                      auVar200._0_4_ = auVar199._0_4_ << 0x1f;
                      auVar200._4_4_ = auVar199._4_4_ << 0x1f;
                      auVar200._8_4_ = auVar199._8_4_ << 0x1f;
                      auVar200._12_4_ = auVar199._12_4_ << 0x1f;
                      iVar135 = movmskps((int)pRVar139,auVar200);
                      if (iVar135 == 0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_14d8._0_4_;
                      }
                      else {
                        local_14d8._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                        local_14d8._4_4_ = 0;
                        fStack_14d0 = 0.0;
                        fStack_14cc = 0.0;
                      }
                      *(undefined4 *)(local_1428 + lVar138 * 4 + -0x10) = 0;
                      valid.field_0.i[0] =
                           -(uint)(fVar308 <= (float)local_14d8._0_4_) & valid.field_0.i[0];
                      valid.field_0.i[1] =
                           -(uint)(fVar214 <= (float)local_14d8._0_4_) & valid.field_0.i[1];
                      valid.field_0.i[2] =
                           -(uint)(fVar288 <= (float)local_14d8._0_4_) & valid.field_0.i[2];
                      valid.field_0.i[3] =
                           -(uint)(fVar216 <= (float)local_14d8._0_4_) & valid.field_0.i[3];
                      iVar135 = movmskps(uVar144,(undefined1  [16])valid.field_0);
                      if (iVar135 == 0) break;
                      auVar201._0_4_ = valid.field_0.i[0] & (uint)fVar308;
                      auVar201._4_4_ = valid.field_0.i[1] & (uint)fVar214;
                      auVar201._8_4_ = valid.field_0.i[2] & (uint)fVar288;
                      auVar201._12_4_ = valid.field_0.i[3] & (uint)fVar216;
                      auVar227._0_8_ =
                           CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                      auVar227._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                      auVar227._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                      auVar227 = auVar227 | auVar201;
                      auVar253._4_4_ = auVar227._0_4_;
                      auVar253._0_4_ = auVar227._4_4_;
                      auVar253._8_4_ = auVar227._12_4_;
                      auVar253._12_4_ = auVar227._8_4_;
                      auVar173 = minps(auVar253,auVar227);
                      auVar202._0_8_ = auVar173._8_8_;
                      auVar202._8_4_ = auVar173._0_4_;
                      auVar202._12_4_ = auVar173._4_4_;
                      auVar173 = minps(auVar202,auVar173);
                      auVar203._0_8_ =
                           CONCAT44(-(uint)(auVar173._4_4_ == auVar227._4_4_) & valid.field_0.i[1],
                                    -(uint)(auVar173._0_4_ == auVar227._0_4_) & valid.field_0.i[0]);
                      auVar203._8_4_ =
                           -(uint)(auVar173._8_4_ == auVar227._8_4_) & valid.field_0.i[2];
                      auVar203._12_4_ =
                           -(uint)(auVar173._12_4_ == auVar227._12_4_) & valid.field_0.i[3];
                      iVar135 = movmskps(iVar135,auVar203);
                      aVar183 = valid.field_0;
                      if (iVar135 != 0) {
                        aVar183.i[2] = auVar203._8_4_;
                        aVar183._0_8_ = auVar203._0_8_;
                        aVar183.i[3] = auVar203._12_4_;
                      }
                      uVar143 = movmskps(iVar135,(undefined1  [16])aVar183);
                      lVar138 = 0;
                      if (CONCAT44(uVar146,uVar143) != 0) {
                        for (; (CONCAT44(uVar146,uVar143) >> lVar138 & 1) == 0;
                            lVar138 = lVar138 + 1) {
                        }
                      }
                    }
                    fVar169 = *(float *)(ray + k * 4 + 0x10);
                    fVar326 = *(float *)(ray + k * 4 + 0x20);
                    fStack_144c = *(float *)(ray + k * 4 + 0x40);
                    local_1498._4_4_ = *(undefined4 *)(ray + k * 4 + 0x50);
                    local_1498._0_4_ = local_1498._4_4_;
                    uStack_1490._0_4_ = (float)local_1498._4_4_;
                    uStack_1490._4_4_ = (float)local_1498._4_4_;
                    local_14d8._4_4_ = *(undefined4 *)(ray + k * 4 + 0x60);
                    local_14d8._0_4_ = local_14d8._4_4_;
                    fStack_14d0 = (float)local_14d8._4_4_;
                    fStack_14cc = (float)local_14d8._4_4_;
                    fVar295 = local_1098 - fVar169;
                    fVar296 = fStack_1094 - fVar169;
                    fVar297 = fStack_1090 - fVar169;
                    fVar307 = fStack_108c - fVar169;
                    fVar327 = local_1088 - fVar169;
                    fVar330 = fStack_1084 - fVar169;
                    fVar331 = fStack_1080 - fVar169;
                    fVar294 = fStack_107c - fVar169;
                    fVar325 = (float)local_1078 - fVar326;
                    fVar323 = local_1078._4_4_ - fVar326;
                    fVar293 = fStack_1070 - fVar326;
                    fVar360 = fStack_106c - fVar326;
                    fStack_1384 = fVar296 + fVar330;
                    local_1388 = fVar295 + fVar327;
                    fStack_1380 = fVar297 + fVar331;
                    fStack_137c = fVar307 + fVar294;
                    fStack_1374 = (fStack_1064 - fVar326) + fVar323;
                    local_1378 = (local_1068 - fVar326) + fVar325;
                    fStack_1370 = (fStack_1060 - fVar326) + fVar293;
                    fStack_136c = (fStack_105c - fVar326) + fVar360;
                    local_1448._4_4_ = fStack_1064 - fVar326;
                    local_1448._0_4_ = local_1068 - fVar326;
                    uStack_1440._0_4_ = fStack_1060 - fVar326;
                    uStack_1440._4_4_ = fStack_105c - fVar326;
                  }
                }
              }
            }
          }
          fVar320 = fVar320 - fVar326;
          fVar306 = fVar306 - fVar326;
          fVar321 = 0.0 - fVar326;
          fVar326 = 0.0 - fVar326;
          fVar363 = fVar363 - fVar169;
          fVar305 = fVar305 - fVar169;
          fVar334 = ((fVar299 - fVar359) * fVar287 + fVar359) - fVar169;
          fVar239 = fVar239 - fVar169;
          fVar287 = *(float *)(ray + k * 4);
          fVar319 = fVar319 - fVar287;
          fVar300 = fVar300 - fVar287;
          fVar369 = extraout_XMM0_Dc - fVar287;
          fVar372 = extraout_XMM0_Dd - fVar287;
          fVar259 = (float)local_1278 - fVar287;
          fVar214 = local_1278._4_4_ - fVar287;
          fVar215 = fStack_1270 - fVar287;
          fVar217 = fStack_126c - fVar287;
          fVar359 = local_1268 - fVar287;
          fVar299 = fStack_1264 - fVar287;
          fVar258 = fStack_1260 - fVar287;
          fVar287 = fStack_125c - fVar287;
          fVar308 = fVar359 - fVar319;
          fVar310 = fVar299 - fVar300;
          fVar311 = fVar258 - fVar369;
          fVar313 = fVar287 - fVar372;
          fVar322 = fVar327 - fVar363;
          fVar298 = fVar330 - fVar305;
          fStack_1270 = fVar331 - fVar334;
          fStack_126c = fVar294 - fVar239;
          fVar316 = fVar325 - fVar320;
          fVar349 = fVar323 - fVar306;
          fStack_1260 = fVar293 - fVar321;
          fStack_125c = fVar360 - fVar326;
          fVar168 = fVar295 - fVar327;
          fVar169 = fVar296 - fVar330;
          fVar288 = fVar297 - fVar331;
          fVar289 = fVar307 - fVar294;
          fVar366 = (float)local_1448 - fVar325;
          fVar368 = local_1448._4_4_ - fVar323;
          fVar371 = (float)uStack_1440 - fVar293;
          fVar362 = uStack_1440._4_4_ - fVar360;
          _local_1268 = CONCAT44(fVar349,fVar316);
          fVar335 = fVar319 - fVar259;
          fVar357 = fVar300 - fVar214;
          fVar358 = fVar369 - fVar215;
          fVar364 = fVar372 - fVar217;
          local_1278 = CONCAT44(fVar298,fVar322);
          fVar361 = fVar363 - fVar295;
          fVar315 = fVar305 - fVar296;
          fVar317 = fVar334 - fVar297;
          fVar318 = fVar239 - fVar307;
          fVar324 = fVar320 - (float)local_1448;
          fVar309 = fVar306 - local_1448._4_4_;
          fVar312 = fVar321 - (float)uStack_1440;
          fVar314 = fVar326 - uStack_1440._4_4_;
          fVar327 = (fVar322 * (fVar325 + fVar320) - (fVar327 + fVar363) * fVar316) * fStack_144c +
                    ((fVar359 + fVar319) * fVar316 - (fVar325 + fVar320) * fVar308) *
                    (float)local_1498._0_4_ +
                    (fVar308 * (fVar327 + fVar363) - (fVar359 + fVar319) * fVar322) *
                    (float)local_14d8._0_4_;
          fVar330 = (fVar298 * (fVar323 + fVar306) - (fVar330 + fVar305) * fVar349) * fStack_144c +
                    ((fVar299 + fVar300) * fVar349 - (fVar323 + fVar306) * fVar310) *
                    (float)local_1498._4_4_ +
                    (fVar310 * (fVar330 + fVar305) - (fVar299 + fVar300) * fVar298) *
                    (float)local_14d8._4_4_;
          fVar331 = (fStack_1270 * (fVar293 + fVar321) - (fVar331 + fVar334) * fStack_1260) *
                    fStack_144c +
                    ((fVar258 + fVar369) * fStack_1260 - (fVar293 + fVar321) * fVar311) *
                    (float)uStack_1490 +
                    (fVar311 * (fVar331 + fVar334) - (fVar258 + fVar369) * fStack_1270) *
                    fStack_14d0;
          fVar360 = (fStack_126c * (fVar360 + fVar326) - (fVar294 + fVar239) * fStack_125c) *
                    fStack_144c +
                    ((fVar287 + fVar372) * fStack_125c - (fVar360 + fVar326) * fVar313) *
                    uStack_1490._4_4_ +
                    (fVar313 * (fVar294 + fVar239) - (fVar287 + fVar372) * fStack_126c) *
                    fStack_14cc;
          fVar323 = fVar259 - fVar359;
          fVar293 = fVar214 - fVar299;
          fVar216 = fVar215 - fVar258;
          fVar240 = fVar217 - fVar287;
          auVar228._0_4_ =
               (fVar361 * ((float)local_1448 + fVar320) - (fVar295 + fVar363) * fVar324) *
               fStack_144c +
               ((fVar319 + fVar259) * fVar324 - ((float)local_1448 + fVar320) * fVar335) *
               (float)local_1498._0_4_ +
               (fVar335 * (fVar295 + fVar363) - (fVar319 + fVar259) * fVar361) *
               (float)local_14d8._0_4_;
          auVar228._4_4_ =
               (fVar315 * (local_1448._4_4_ + fVar306) - (fVar296 + fVar305) * fVar309) *
               fStack_144c +
               ((fVar300 + fVar214) * fVar309 - (local_1448._4_4_ + fVar306) * fVar357) *
               (float)local_1498._4_4_ +
               (fVar357 * (fVar296 + fVar305) - (fVar300 + fVar214) * fVar315) *
               (float)local_14d8._4_4_;
          auVar228._8_4_ =
               (fVar317 * ((float)uStack_1440 + fVar321) - (fVar297 + fVar334) * fVar312) *
               fStack_144c +
               ((fVar369 + fVar215) * fVar312 - ((float)uStack_1440 + fVar321) * fVar358) *
               (float)uStack_1490 +
               (fVar358 * (fVar297 + fVar334) - (fVar369 + fVar215) * fVar317) * fStack_14d0;
          auVar228._12_4_ =
               (fVar318 * (uStack_1440._4_4_ + fVar326) - (fVar307 + fVar239) * fVar314) *
               fStack_144c +
               ((fVar372 + fVar217) * fVar314 - (uStack_1440._4_4_ + fVar326) * fVar364) *
               uStack_1490._4_4_ +
               (fVar364 * (fVar307 + fVar239) - (fVar372 + fVar217) * fVar318) * fStack_14cc;
          auVar204._0_4_ =
               (fVar168 * local_1378 - local_1388 * fVar366) * fStack_144c +
               ((fVar359 + fVar259) * fVar366 - local_1378 * fVar323) * (float)local_1498._0_4_ +
               (fVar323 * local_1388 - (fVar359 + fVar259) * fVar168) * (float)local_14d8._0_4_;
          auVar204._4_4_ =
               (fVar169 * fStack_1374 - fStack_1384 * fVar368) * fStack_144c +
               ((fVar299 + fVar214) * fVar368 - fStack_1374 * fVar293) * (float)local_1498._4_4_ +
               (fVar293 * fStack_1384 - (fVar299 + fVar214) * fVar169) * (float)local_14d8._4_4_;
          auVar204._8_4_ =
               (fVar288 * fStack_1370 - fStack_1380 * fVar371) * fStack_144c +
               ((fVar258 + fVar215) * fVar371 - fStack_1370 * fVar216) * (float)uStack_1490 +
               (fVar216 * fStack_1380 - (fVar258 + fVar215) * fVar288) * fStack_14d0;
          auVar204._12_4_ =
               (fVar289 * fStack_136c - fStack_137c * fVar362) * fStack_144c +
               ((fVar287 + fVar217) * fVar362 - fStack_136c * fVar240) * uStack_1490._4_4_ +
               (fVar240 * fStack_137c - (fVar287 + fVar217) * fVar289) * fStack_14cc;
          auVar266._0_4_ = fVar327 + auVar228._0_4_ + auVar204._0_4_;
          auVar266._4_4_ = fVar330 + auVar228._4_4_ + auVar204._4_4_;
          auVar266._8_4_ = fVar331 + auVar228._8_4_ + auVar204._8_4_;
          auVar266._12_4_ = fVar360 + auVar228._12_4_ + auVar204._12_4_;
          uVar149 = CONCAT44(auVar266._4_4_,auVar266._0_4_);
          auVar302._8_4_ = fVar331;
          auVar302._0_8_ = CONCAT44(fVar330,fVar327);
          auVar302._12_4_ = fVar360;
          auVar173 = minps(auVar302,auVar228);
          auVar222 = minps(auVar173,auVar204);
          auVar184._8_4_ = fVar331;
          auVar184._0_8_ = CONCAT44(fVar330,fVar327);
          auVar184._12_4_ = fVar360;
          auVar173 = maxps(auVar184,auVar228);
          auVar173 = maxps(auVar173,auVar204);
          fVar287 = ABS(auVar266._8_4_) * 1.1920929e-07;
          fVar359 = ABS(auVar266._12_4_) * 1.1920929e-07;
          auVar185._4_4_ = -(uint)(auVar173._4_4_ <= ABS(auVar266._4_4_) * 1.1920929e-07);
          auVar185._0_4_ = -(uint)(auVar173._0_4_ <= ABS(auVar266._0_4_) * 1.1920929e-07);
          auVar185._8_4_ = -(uint)(auVar173._8_4_ <= fVar287);
          auVar185._12_4_ = -(uint)(auVar173._12_4_ <= fVar359);
          auVar303._4_4_ = -(uint)(-(ABS(auVar266._4_4_) * 1.1920929e-07) <= auVar222._4_4_);
          auVar303._0_4_ = -(uint)(-(ABS(auVar266._0_4_) * 1.1920929e-07) <= auVar222._0_4_);
          auVar303._8_4_ = -(uint)(-fVar287 <= auVar222._8_4_);
          auVar303._12_4_ = -(uint)(-fVar359 <= auVar222._12_4_);
          auVar185 = auVar185 | auVar303;
          iVar135 = movmskps(uVar144,auVar185);
          auVar173 = local_1298;
          fVar299 = local_1288;
          fVar258 = fStack_1284;
          fVar259 = fStack_1280;
          fVar325 = fStack_127c;
          fVar359 = local_1178;
          fVar214 = fStack_1174;
          fVar215 = fStack_1170;
          fVar217 = fStack_116c;
          if (iVar135 != 0) {
            uVar156 = -(uint)(ABS(fVar168 * fVar324) <= ABS(fVar361 * fVar316));
            uVar159 = -(uint)(ABS(fVar169 * fVar309) <= ABS(fVar315 * fVar349));
            uVar162 = -(uint)(ABS(fVar288 * fVar312) <= ABS(fVar317 * fStack_1260));
            uVar165 = -(uint)(ABS(fVar289 * fVar314) <= ABS(fVar318 * fStack_125c));
            uVar157 = -(uint)(ABS(fVar335 * fVar366) <= ABS(fVar308 * fVar324));
            uVar160 = -(uint)(ABS(fVar357 * fVar368) <= ABS(fVar310 * fVar309));
            uVar163 = -(uint)(ABS(fVar358 * fVar371) <= ABS(fVar311 * fVar312));
            uVar166 = -(uint)(ABS(fVar364 * fVar362) <= ABS(fVar313 * fVar314));
            uVar158 = -(uint)(ABS(fVar323 * fVar361) <= ABS(fVar335 * fVar322));
            uVar161 = -(uint)(ABS(fVar293 * fVar315) <= ABS(fVar357 * fVar298));
            uVar164 = -(uint)(ABS(fVar216 * fVar317) <= ABS(fVar358 * fStack_1270));
            uVar167 = -(uint)(ABS(fVar240 * fVar318) <= ABS(fVar364 * fStack_126c));
            fVar365 = (float)(~uVar156 & (uint)(fVar322 * fVar324 - fVar361 * fVar316) |
                             (uint)(fVar361 * fVar366 - fVar168 * fVar324) & uVar156);
            fVar367 = (float)(~uVar159 & (uint)(fVar298 * fVar309 - fVar315 * fVar349) |
                             (uint)(fVar315 * fVar368 - fVar169 * fVar309) & uVar159);
            fVar370 = (float)(~uVar162 & (uint)(fStack_1270 * fVar312 - fVar317 * fStack_1260) |
                             (uint)(fVar317 * fVar371 - fVar288 * fVar312) & uVar162);
            fVar373 = (float)(~uVar165 & (uint)(fStack_126c * fVar314 - fVar318 * fStack_125c) |
                             (uint)(fVar318 * fVar362 - fVar289 * fVar314) & uVar165);
            fVar294 = (float)(~uVar157 & (uint)(fVar316 * fVar335 - fVar308 * fVar324) |
                             (uint)(fVar323 * fVar324 - fVar335 * fVar366) & uVar157);
            fVar295 = (float)(~uVar160 & (uint)(fVar349 * fVar357 - fVar310 * fVar309) |
                             (uint)(fVar293 * fVar309 - fVar357 * fVar368) & uVar160);
            fVar296 = (float)(~uVar163 & (uint)(fStack_1260 * fVar358 - fVar311 * fVar312) |
                             (uint)(fVar216 * fVar312 - fVar358 * fVar371) & uVar163);
            fVar297 = (float)(~uVar166 & (uint)(fStack_125c * fVar364 - fVar313 * fVar314) |
                             (uint)(fVar240 * fVar314 - fVar364 * fVar362) & uVar166);
            fVar307 = (float)(~uVar158 & (uint)(fVar308 * fVar361 - fVar335 * fVar322) |
                             (uint)(fVar335 * fVar168 - fVar323 * fVar361) & uVar158);
            fVar293 = (float)(~uVar161 & (uint)(fVar310 * fVar315 - fVar357 * fVar298) |
                             (uint)(fVar357 * fVar169 - fVar293 * fVar315) & uVar161);
            fVar288 = (float)(~uVar164 & (uint)(fVar311 * fVar317 - fVar358 * fStack_1270) |
                             (uint)(fVar358 * fVar288 - fVar216 * fVar317) & uVar164);
            fVar289 = (float)(~uVar167 & (uint)(fVar313 * fVar318 - fVar364 * fStack_126c) |
                             (uint)(fVar364 * fVar289 - fVar240 * fVar318) & uVar167);
            fVar287 = fStack_144c * fVar365 +
                      (float)local_1498._0_4_ * fVar294 + (float)local_14d8._0_4_ * fVar307;
            fVar168 = fStack_144c * fVar367 +
                      (float)local_1498._4_4_ * fVar295 + (float)local_14d8._4_4_ * fVar293;
            fVar169 = fStack_144c * fVar370 + (float)uStack_1490 * fVar296 + fStack_14d0 * fVar288;
            fVar323 = fStack_144c * fVar373 + uStack_1490._4_4_ * fVar297 + fStack_14cc * fVar289;
            auVar276._0_4_ = fVar287 + fVar287;
            auVar276._4_4_ = fVar168 + fVar168;
            auVar276._8_4_ = fVar169 + fVar169;
            auVar276._12_4_ = fVar323 + fVar323;
            auVar229._0_4_ = fVar320 * fVar307;
            auVar229._4_4_ = fVar306 * fVar293;
            auVar229._8_4_ = fVar321 * fVar288;
            auVar229._12_4_ = fVar326 * fVar289;
            auVar205._0_4_ = fVar363 * fVar294 + auVar229._0_4_;
            auVar205._4_4_ = fVar305 * fVar295 + auVar229._4_4_;
            auVar205._8_4_ = fVar334 * fVar296 + auVar229._8_4_;
            auVar205._12_4_ = fVar239 * fVar297 + auVar229._12_4_;
            fVar334 = fVar319 * fVar365 + auVar205._0_4_;
            fVar363 = fVar300 * fVar367 + auVar205._4_4_;
            fVar305 = fVar369 * fVar370 + auVar205._8_4_;
            fVar239 = fVar372 * fVar373 + auVar205._12_4_;
            auVar222 = rcpps(auVar205,auVar276);
            fVar287 = auVar222._0_4_;
            fVar168 = auVar222._4_4_;
            fVar169 = auVar222._8_4_;
            fVar326 = auVar222._12_4_;
            auVar284._0_4_ =
                 ((1.0 - auVar276._0_4_ * fVar287) * fVar287 + fVar287) * (fVar334 + fVar334);
            auVar284._4_4_ =
                 ((1.0 - auVar276._4_4_ * fVar168) * fVar168 + fVar168) * (fVar363 + fVar363);
            auVar284._8_4_ =
                 ((1.0 - auVar276._8_4_ * fVar169) * fVar169 + fVar169) * (fVar305 + fVar305);
            auVar284._12_4_ =
                 ((1.0 - auVar276._12_4_ * fVar326) * fVar326 + fVar326) * (fVar239 + fVar239);
            fVar287 = *(float *)(ray + k * 4 + 0x80);
            fVar168 = *(float *)(ray + k * 4 + 0x30);
            auVar206._0_4_ =
                 -(uint)(auVar284._0_4_ <= fVar287 && fVar168 <= auVar284._0_4_) & auVar185._0_4_;
            auVar206._4_4_ =
                 -(uint)(auVar284._4_4_ <= fVar287 && fVar168 <= auVar284._4_4_) & auVar185._4_4_;
            auVar206._8_4_ =
                 -(uint)(auVar284._8_4_ <= fVar287 && fVar168 <= auVar284._8_4_) & auVar185._8_4_;
            auVar206._12_4_ =
                 -(uint)(auVar284._12_4_ <= fVar287 && fVar168 <= auVar284._12_4_) & auVar185._12_4_
            ;
            iVar135 = movmskps(uVar144,auVar206);
            if (iVar135 != 0) {
              aVar207._0_4_ = auVar206._0_4_ & -(uint)(auVar276._0_4_ != 0.0);
              aVar207._4_4_ = auVar206._4_4_ & -(uint)(auVar276._4_4_ != 0.0);
              aVar207._8_4_ = auVar206._8_4_ & -(uint)(auVar276._8_4_ != 0.0);
              aVar207._12_4_ = auVar206._12_4_ & -(uint)(auVar276._12_4_ != 0.0);
              iVar135 = movmskps(iVar135,(undefined1  [16])aVar207);
              if (iVar135 != 0) {
                _local_12e8 = auVar284;
                local_12d8[0] = fVar365;
                local_12d8[1] = fVar367;
                local_12d8[2] = fVar370;
                local_12d8[3] = fVar373;
                local_12c8._4_4_ = fVar295;
                local_12c8._0_4_ = fVar294;
                fStack_12c0 = fVar296;
                fStack_12bc = fVar297;
                local_12b8[0] = fVar307;
                local_12b8[1] = fVar293;
                local_12b8[2] = fVar288;
                local_12b8[3] = fVar289;
                auVar254._0_4_ = auVar266._0_4_ - auVar228._0_4_;
                auVar254._4_4_ = auVar266._4_4_ - auVar228._4_4_;
                auVar254._8_4_ = auVar266._8_4_ - auVar228._8_4_;
                auVar254._12_4_ = auVar266._12_4_ - auVar228._12_4_;
                auVar230._4_12_ = auVar229._4_12_;
                auVar230._0_4_ = (float)(int)(*(ushort *)(lVar19 + 8 + lVar154) - 1);
                auVar277._4_4_ = auVar229._4_4_;
                auVar277._0_4_ = auVar230._0_4_;
                auVar277._8_4_ = auVar229._8_4_;
                auVar277._12_4_ = auVar229._12_4_;
                auVar222 = rcpss(auVar277,auVar230);
                fVar168 = (2.0 - auVar230._0_4_ * auVar222._0_4_) * auVar222._0_4_;
                auVar278._4_12_ = auVar222._4_12_;
                auVar278._0_4_ = (float)(int)(*(ushort *)(lVar19 + 10 + lVar154) - 1);
                auVar304._4_4_ = auVar222._4_4_;
                auVar304._0_4_ = auVar278._0_4_;
                auVar304._8_4_ = auVar222._8_4_;
                auVar304._12_4_ = auVar222._12_4_;
                auVar222 = rcpss(auVar304,auVar278);
                fVar169 = (2.0 - auVar278._0_4_ * auVar222._0_4_) * auVar222._0_4_;
                tNear.field_0.v[0] =
                     fVar168 * ((float)sx.field_0.i[0] * auVar266._0_4_ + (auVar266._0_4_ - fVar327)
                               );
                tNear.field_0.v[1] =
                     fVar168 * ((float)(sx.field_0.i[1] + 1) * auVar266._4_4_ +
                               (auVar266._4_4_ - fVar330));
                tNear.field_0.v[2] =
                     fVar168 * ((float)(sx.field_0.i[2] + 1) * auVar266._8_4_ +
                               (auVar266._8_4_ - fVar331));
                tNear.field_0.v[3] =
                     fVar168 * ((float)sx.field_0.i[3] * auVar266._12_4_ +
                               (auVar266._12_4_ - fVar360));
                pGVar18 = (context->scene->geometries).items[uVar153].ptr;
                if ((pGVar18->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar222 = rcpps(auVar254,auVar266);
                  fVar168 = auVar222._0_4_;
                  fVar326 = auVar222._4_4_;
                  fVar334 = auVar222._8_4_;
                  fVar363 = auVar222._12_4_;
                  local_1468 = (float)(uVar149 & 0x7fffffff7fffffff);
                  fStack_1464 = (float)((uVar149 & 0x7fffffff7fffffff) >> 0x20);
                  fVar168 = (float)(-(uint)(1e-18 <= local_1468) &
                                   (uint)(((float)DAT_01f46a60 - auVar266._0_4_ * fVar168) * fVar168
                                         + fVar168));
                  fVar326 = (float)(-(uint)(1e-18 <= fStack_1464) &
                                   (uint)((DAT_01f46a60._4_4_ - auVar266._4_4_ * fVar326) * fVar326
                                         + fVar326));
                  fVar334 = (float)(-(uint)(1e-18 <= ABS(auVar266._8_4_)) &
                                   (uint)((DAT_01f46a60._8_4_ - auVar266._8_4_ * fVar334) * fVar334
                                         + fVar334));
                  fVar363 = (float)(-(uint)(1e-18 <= ABS(auVar266._12_4_)) &
                                   (uint)((DAT_01f46a60._12_4_ - auVar266._12_4_ * fVar363) *
                                          fVar363 + fVar363));
                  auVar186._0_4_ = tNear.field_0.v[0] * fVar168;
                  auVar186._4_4_ = tNear.field_0.v[1] * fVar326;
                  auVar186._8_4_ = tNear.field_0.v[2] * fVar334;
                  auVar186._12_4_ = tNear.field_0.v[3] * fVar363;
                  local_1308 = minps(auVar186,_DAT_01f46a60);
                  auVar231._0_4_ =
                       fVar169 * ((float)sy.field_0.i[1] * auVar266._0_4_ + auVar254._0_4_) *
                       fVar168;
                  auVar231._4_4_ =
                       fVar169 * ((float)sy.field_0.i[1] * auVar266._4_4_ + auVar254._4_4_) *
                       fVar326;
                  auVar231._8_4_ =
                       fVar169 * ((float)(sy.field_0.i[1] + 1) * auVar266._8_4_ + auVar254._8_4_) *
                       fVar334;
                  auVar231._12_4_ =
                       fVar169 * ((float)(sy.field_0.i[1] + 1) * auVar266._12_4_ + auVar254._12_4_)
                       * fVar363;
                  local_12f8 = minps(auVar231,_DAT_01f46a60);
                  auVar285._0_4_ = (uint)auVar284._0_4_ & aVar207._0_4_;
                  auVar285._4_4_ = (uint)auVar284._4_4_ & aVar207._4_4_;
                  auVar285._8_4_ = (uint)auVar284._8_4_ & aVar207._8_4_;
                  auVar285._12_4_ = (uint)auVar284._12_4_ & aVar207._12_4_;
                  auVar232._0_8_ = CONCAT44(~aVar207._4_4_,~aVar207._0_4_) & 0x7f8000007f800000;
                  auVar232._8_4_ = ~aVar207._8_4_ & 0x7f800000;
                  auVar232._12_4_ = ~aVar207._12_4_ & 0x7f800000;
                  auVar232 = auVar232 | auVar285;
                  auVar255._4_4_ = auVar232._0_4_;
                  auVar255._0_4_ = auVar232._4_4_;
                  auVar255._8_4_ = auVar232._12_4_;
                  auVar255._12_4_ = auVar232._8_4_;
                  auVar222 = minps(auVar255,auVar232);
                  auVar187._0_8_ = auVar222._8_8_;
                  auVar187._8_4_ = auVar222._0_4_;
                  auVar187._12_4_ = auVar222._4_4_;
                  auVar222 = minps(auVar187,auVar222);
                  uVar160 = -(uint)(auVar222._0_4_ == auVar232._0_4_);
                  uVar161 = -(uint)(auVar222._4_4_ == auVar232._4_4_);
                  uVar162 = -(uint)(auVar222._8_4_ == auVar232._8_4_);
                  uVar163 = -(uint)(auVar222._12_4_ == auVar232._12_4_);
                  auVar233._0_4_ = uVar160 & aVar207._0_4_;
                  auVar233._4_4_ = uVar161 & aVar207._4_4_;
                  auVar233._8_4_ = uVar162 & aVar207._8_4_;
                  auVar233._12_4_ = uVar163 & aVar207._12_4_;
                  iVar135 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar233);
                  uVar156 = 0xffffffff;
                  uVar157 = 0xffffffff;
                  uVar158 = 0xffffffff;
                  uVar159 = 0xffffffff;
                  if (iVar135 != 0) {
                    uVar156 = uVar160;
                    uVar157 = uVar161;
                    uVar158 = uVar162;
                    uVar159 = uVar163;
                  }
                  auVar208._0_4_ = aVar207._0_4_ & uVar156;
                  auVar208._4_4_ = aVar207._4_4_ & uVar157;
                  auVar208._8_4_ = aVar207._8_4_ & uVar158;
                  auVar208._12_4_ = aVar207._12_4_ & uVar159;
                  uVar156 = movmskps(iVar135,auVar208);
                  lVar138 = 0;
                  if (uVar156 != 0) {
                    for (; (uVar156 >> lVar138 & 1) == 0; lVar138 = lVar138 + 1) {
                    }
                  }
                  valid.field_0 = aVar207;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar18->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar143 = *(undefined4 *)(local_1308 + lVar138 * 4);
                    uVar15 = *(undefined4 *)(local_12f8 + lVar138 * 4);
                    fVar287 = local_12d8[lVar138];
                    fVar168 = local_12b8[lVar138 + -4];
                    fVar169 = local_12b8[lVar138];
                    *(float *)(ray + k * 4 + 0x80) = local_12d8[lVar138 + -4];
                    *(float *)(ray + k * 4 + 0xc0) = fVar287;
                    *(float *)(ray + k * 4 + 0xd0) = fVar168;
                    *(float *)(ray + k * 4 + 0xe0) = fVar169;
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar143;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar15;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_1410;
                    *(uint *)(ray + k * 4 + 0x120) = uVar141;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_14c8 = CONCAT44(local_1188._0_4_,local_1188._0_4_);
                    uStack_14c0._0_4_ = local_1188._0_4_;
                    uStack_14c0._4_4_ = local_1188._0_4_;
                    local_1498._4_4_ = local_1198._0_4_;
                    local_1498._0_4_ = local_1198._0_4_;
                    uStack_1490._0_4_ = (float)local_1198._0_4_;
                    uStack_1490._4_4_ = (float)local_1198._0_4_;
                    auVar116 = *(undefined1 (*) [12])(mm_lookupmask_ps + lVar136);
                    uStack_149c = (undefined4)
                                  ((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar136 + 8) >> 0x20);
                    while( true ) {
                      local_1128 = *(undefined4 *)(local_1308 + lVar138 * 4);
                      uVar143 = *(undefined4 *)(local_12f8 + lVar138 * 4);
                      *(float *)(ray + k * 4 + 0x80) = local_12d8[lVar138 + -4];
                      args.context = context->user;
                      local_1118._4_4_ = uVar143;
                      local_1118._0_4_ = uVar143;
                      local_1118._8_4_ = uVar143;
                      local_1118._12_4_ = uVar143;
                      local_1158 = local_12d8[lVar138];
                      fVar168 = local_12b8[lVar138 + -4];
                      fVar169 = local_12b8[lVar138];
                      local_1148._4_4_ = fVar168;
                      local_1148._0_4_ = fVar168;
                      fStack_1140 = fVar168;
                      fStack_113c = fVar168;
                      local_1138._4_4_ = fVar169;
                      local_1138._0_4_ = fVar169;
                      fStack_1130 = fVar169;
                      fStack_112c = fVar169;
                      fStack_1154 = local_1158;
                      fStack_1150 = local_1158;
                      fStack_114c = local_1158;
                      uStack_1124 = local_1128;
                      uStack_1120 = local_1128;
                      uStack_111c = local_1128;
                      local_1108 = local_1498;
                      uStack_1100 = uStack_1490;
                      local_10f8 = local_14c8;
                      uStack_10f0 = uStack_14c0;
                      local_10e8 = (args.context)->instID[0];
                      uStack_10e4 = local_10e8;
                      uStack_10e0 = local_10e8;
                      uStack_10dc = local_10e8;
                      local_10d8 = (args.context)->instPrimID[0];
                      uStack_10d4 = local_10d8;
                      uStack_10d0 = local_10d8;
                      uStack_10cc = local_10d8;
                      local_1428._12_4_ = uStack_149c;
                      local_1428._0_12_ = auVar116;
                      args.valid = (int *)local_1428;
                      args.geometryUserPtr = pGVar18->userPtr;
                      args.ray = (RTCRayN *)ray;
                      args.hit = (RTCHitN *)&local_1158;
                      args.N = 4;
                      p_Var140 = pGVar18->intersectionFilterN;
                      if (p_Var140 != (RTCFilterFunctionN)0x0) {
                        p_Var140 = (RTCFilterFunctionN)(*p_Var140)(&args);
                      }
                      auVar209._0_4_ = -(uint)(local_1428._0_4_ == 0);
                      auVar209._4_4_ = -(uint)(local_1428._4_4_ == 0);
                      auVar209._8_4_ = -(uint)(local_1428._8_4_ == 0);
                      auVar209._12_4_ = -(uint)(local_1428._12_4_ == 0);
                      uVar141 = movmskps((int)p_Var140,auVar209);
                      pRVar139 = (RTCRayN *)(ulong)(uVar141 ^ 0xf);
                      if ((uVar141 ^ 0xf) == 0) {
                        auVar209 = auVar209 ^ _DAT_01f46b70;
                      }
                      else {
                        p_Var140 = context->args->filter;
                        if ((p_Var140 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar18->field_8).field_0x2 & 0x40) != 0)))) {
                          p_Var140 = (RTCFilterFunctionN)(*p_Var140)(&args);
                        }
                        auVar188._0_4_ = -(uint)(local_1428._0_4_ == 0);
                        auVar188._4_4_ = -(uint)(local_1428._4_4_ == 0);
                        auVar188._8_4_ = -(uint)(local_1428._8_4_ == 0);
                        auVar188._12_4_ = -(uint)(local_1428._12_4_ == 0);
                        auVar209 = auVar188 ^ _DAT_01f46b70;
                        uVar141 = movmskps((int)p_Var140,auVar188);
                        pRVar139 = (RTCRayN *)(ulong)(uVar141 ^ 0xf);
                        if ((uVar141 ^ 0xf) != 0) {
                          auVar234._0_4_ = *(uint *)(args.ray + 0xc0) & auVar188._0_4_;
                          auVar234._4_4_ = *(uint *)(args.ray + 0xc4) & auVar188._4_4_;
                          auVar234._8_4_ = *(uint *)(args.ray + 200) & auVar188._8_4_;
                          auVar234._12_4_ = *(uint *)(args.ray + 0xcc) & auVar188._12_4_;
                          auVar286._0_4_ = ~auVar188._0_4_ & *(uint *)args.hit;
                          auVar286._4_4_ = ~auVar188._4_4_ & *(uint *)(args.hit + 4);
                          auVar286._8_4_ = ~auVar188._8_4_ & *(uint *)(args.hit + 8);
                          auVar286._12_4_ = ~auVar188._12_4_ & *(uint *)(args.hit + 0xc);
                          *(undefined1 (*) [16])(args.ray + 0xc0) = auVar286 | auVar234;
                          uVar141 = *(uint *)(args.hit + 0x14);
                          uVar156 = *(uint *)(args.hit + 0x18);
                          uVar157 = *(uint *)(args.hit + 0x1c);
                          *(uint *)(args.ray + 0xd0) =
                               ~auVar188._0_4_ & *(uint *)(args.hit + 0x10) |
                               *(uint *)(args.ray + 0xd0) & auVar188._0_4_;
                          *(uint *)(args.ray + 0xd4) =
                               ~auVar188._4_4_ & uVar141 |
                               *(uint *)(args.ray + 0xd4) & auVar188._4_4_;
                          *(uint *)(args.ray + 0xd8) =
                               ~auVar188._8_4_ & uVar156 |
                               *(uint *)(args.ray + 0xd8) & auVar188._8_4_;
                          *(uint *)(args.ray + 0xdc) =
                               ~auVar188._12_4_ & uVar157 |
                               *(uint *)(args.ray + 0xdc) & auVar188._12_4_;
                          auVar267._0_4_ = *(uint *)(args.ray + 0xe0) & auVar188._0_4_;
                          auVar267._4_4_ = *(uint *)(args.ray + 0xe4) & auVar188._4_4_;
                          auVar267._8_4_ = *(uint *)(args.ray + 0xe8) & auVar188._8_4_;
                          auVar267._12_4_ = *(uint *)(args.ray + 0xec) & auVar188._12_4_;
                          auVar235._0_4_ = ~auVar188._0_4_ & *(uint *)(args.hit + 0x20);
                          auVar235._4_4_ = ~auVar188._4_4_ & *(uint *)(args.hit + 0x24);
                          auVar235._8_4_ = ~auVar188._8_4_ & *(uint *)(args.hit + 0x28);
                          auVar235._12_4_ = ~auVar188._12_4_ & *(uint *)(args.hit + 0x2c);
                          *(undefined1 (*) [16])(args.ray + 0xe0) = auVar235 | auVar267;
                          auVar279._0_4_ = *(uint *)(args.ray + 0xf0) & auVar188._0_4_;
                          auVar279._4_4_ = *(uint *)(args.ray + 0xf4) & auVar188._4_4_;
                          auVar279._8_4_ = *(uint *)(args.ray + 0xf8) & auVar188._8_4_;
                          auVar279._12_4_ = *(uint *)(args.ray + 0xfc) & auVar188._12_4_;
                          auVar236._0_4_ = ~auVar188._0_4_ & *(uint *)(args.hit + 0x30);
                          auVar236._4_4_ = ~auVar188._4_4_ & *(uint *)(args.hit + 0x34);
                          auVar236._8_4_ = ~auVar188._8_4_ & *(uint *)(args.hit + 0x38);
                          auVar236._12_4_ = ~auVar188._12_4_ & *(uint *)(args.hit + 0x3c);
                          *(undefined1 (*) [16])(args.ray + 0xf0) = auVar236 | auVar279;
                          uVar141 = *(uint *)(args.hit + 0x44);
                          uVar156 = *(uint *)(args.hit + 0x48);
                          uVar157 = *(uint *)(args.hit + 0x4c);
                          *(uint *)(args.ray + 0x100) =
                               ~auVar188._0_4_ & *(uint *)(args.hit + 0x40) |
                               *(uint *)(args.ray + 0x100) & auVar188._0_4_;
                          *(uint *)(args.ray + 0x104) =
                               ~auVar188._4_4_ & uVar141 |
                               *(uint *)(args.ray + 0x104) & auVar188._4_4_;
                          *(uint *)(args.ray + 0x108) =
                               ~auVar188._8_4_ & uVar156 |
                               *(uint *)(args.ray + 0x108) & auVar188._8_4_;
                          *(uint *)(args.ray + 0x10c) =
                               ~auVar188._12_4_ & uVar157 |
                               *(uint *)(args.ray + 0x10c) & auVar188._12_4_;
                          uVar141 = *(uint *)(args.hit + 0x54);
                          uVar156 = *(uint *)(args.hit + 0x58);
                          uVar157 = *(uint *)(args.hit + 0x5c);
                          *(uint *)(args.ray + 0x110) =
                               *(uint *)(args.ray + 0x110) & auVar188._0_4_ |
                               ~auVar188._0_4_ & *(uint *)(args.hit + 0x50);
                          *(uint *)(args.ray + 0x114) =
                               *(uint *)(args.ray + 0x114) & auVar188._4_4_ |
                               ~auVar188._4_4_ & uVar141;
                          *(uint *)(args.ray + 0x118) =
                               *(uint *)(args.ray + 0x118) & auVar188._8_4_ |
                               ~auVar188._8_4_ & uVar156;
                          *(uint *)(args.ray + 0x11c) =
                               *(uint *)(args.ray + 0x11c) & auVar188._12_4_ |
                               ~auVar188._12_4_ & uVar157;
                          uVar141 = *(uint *)(args.hit + 100);
                          uVar156 = *(uint *)(args.hit + 0x68);
                          uVar157 = *(uint *)(args.hit + 0x6c);
                          *(uint *)(args.ray + 0x120) =
                               *(uint *)(args.ray + 0x120) & auVar188._0_4_ |
                               ~auVar188._0_4_ & *(uint *)(args.hit + 0x60);
                          *(uint *)(args.ray + 0x124) =
                               *(uint *)(args.ray + 0x124) & auVar188._4_4_ |
                               ~auVar188._4_4_ & uVar141;
                          *(uint *)(args.ray + 0x128) =
                               *(uint *)(args.ray + 0x128) & auVar188._8_4_ |
                               ~auVar188._8_4_ & uVar156;
                          *(uint *)(args.ray + 300) =
                               *(uint *)(args.ray + 300) & auVar188._12_4_ |
                               ~auVar188._12_4_ & uVar157;
                          auVar237._0_4_ = *(uint *)(args.ray + 0x130) & auVar188._0_4_;
                          auVar237._4_4_ = *(uint *)(args.ray + 0x134) & auVar188._4_4_;
                          auVar237._8_4_ = *(uint *)(args.ray + 0x138) & auVar188._8_4_;
                          auVar237._12_4_ = *(uint *)(args.ray + 0x13c) & auVar188._12_4_;
                          auVar256._0_4_ = ~auVar188._0_4_ & *(uint *)(args.hit + 0x70);
                          auVar256._4_4_ = ~auVar188._4_4_ & *(uint *)(args.hit + 0x74);
                          auVar256._8_4_ = ~auVar188._8_4_ & *(uint *)(args.hit + 0x78);
                          auVar256._12_4_ = ~auVar188._12_4_ & *(uint *)(args.hit + 0x7c);
                          *(undefined1 (*) [16])(args.ray + 0x130) = auVar256 | auVar237;
                          *(undefined1 (*) [16])(args.ray + 0x140) =
                               ~auVar188 & *(undefined1 (*) [16])(args.hit + 0x80) |
                               *(undefined1 (*) [16])(args.ray + 0x140) & auVar188;
                          pRVar139 = args.ray;
                        }
                      }
                      auVar210._0_4_ = auVar209._0_4_ << 0x1f;
                      auVar210._4_4_ = auVar209._4_4_ << 0x1f;
                      auVar210._8_4_ = auVar209._8_4_ << 0x1f;
                      auVar210._12_4_ = auVar209._12_4_ << 0x1f;
                      iVar135 = movmskps((int)pRVar139,auVar210);
                      if (iVar135 == 0) {
                        *(float *)(ray + k * 4 + 0x80) = fVar287;
                      }
                      else {
                        fVar287 = *(float *)(ray + k * 4 + 0x80);
                      }
                      *(undefined4 *)(local_1428 + lVar138 * 4 + -0x10) = 0;
                      valid.field_0.i[0] = -(uint)(auVar284._0_4_ <= fVar287) & valid.field_0.i[0];
                      valid.field_0.i[1] = -(uint)(auVar284._4_4_ <= fVar287) & valid.field_0.i[1];
                      valid.field_0.i[2] = -(uint)(auVar284._8_4_ <= fVar287) & valid.field_0.i[2];
                      valid.field_0.i[3] = -(uint)(auVar284._12_4_ <= fVar287) & valid.field_0.i[3];
                      iVar135 = movmskps(uVar144,(undefined1  [16])valid.field_0);
                      auVar173 = local_1298;
                      fVar299 = local_1288;
                      fVar258 = fStack_1284;
                      fVar259 = fStack_1280;
                      fVar325 = fStack_127c;
                      fVar359 = local_1178;
                      fVar214 = fStack_1174;
                      fVar215 = fStack_1170;
                      fVar217 = fStack_116c;
                      if (iVar135 == 0) break;
                      auVar211._0_4_ = valid.field_0.i[0] & (uint)auVar284._0_4_;
                      auVar211._4_4_ = valid.field_0.i[1] & (uint)auVar284._4_4_;
                      auVar211._8_4_ = valid.field_0.i[2] & (uint)auVar284._8_4_;
                      auVar211._12_4_ = valid.field_0.i[3] & (uint)auVar284._12_4_;
                      auVar238._0_8_ =
                           CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                      auVar238._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                      auVar238._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                      auVar238 = auVar238 | auVar211;
                      auVar257._4_4_ = auVar238._0_4_;
                      auVar257._0_4_ = auVar238._4_4_;
                      auVar257._8_4_ = auVar238._12_4_;
                      auVar257._12_4_ = auVar238._8_4_;
                      auVar173 = minps(auVar257,auVar238);
                      auVar212._0_8_ = auVar173._8_8_;
                      auVar212._8_4_ = auVar173._0_4_;
                      auVar212._12_4_ = auVar173._4_4_;
                      auVar173 = minps(auVar212,auVar173);
                      auVar213._0_8_ =
                           CONCAT44(-(uint)(auVar173._4_4_ == auVar238._4_4_) & valid.field_0.i[1],
                                    -(uint)(auVar173._0_4_ == auVar238._0_4_) & valid.field_0.i[0]);
                      auVar213._8_4_ =
                           -(uint)(auVar173._8_4_ == auVar238._8_4_) & valid.field_0.i[2];
                      auVar213._12_4_ =
                           -(uint)(auVar173._12_4_ == auVar238._12_4_) & valid.field_0.i[3];
                      iVar135 = movmskps(iVar135,auVar213);
                      aVar189 = valid.field_0;
                      if (iVar135 != 0) {
                        aVar189.i[2] = auVar213._8_4_;
                        aVar189._0_8_ = auVar213._0_8_;
                        aVar189.i[3] = auVar213._12_4_;
                      }
                      uVar143 = movmskps(iVar135,(undefined1  [16])aVar189);
                      lVar138 = 0;
                      if (CONCAT44(uVar146,uVar143) != 0) {
                        for (; (CONCAT44(uVar146,uVar143) >> lVar138 & 1) == 0;
                            lVar138 = lVar138 + 1) {
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      uVar149 = local_1230;
      uVar150 = local_1238;
      uVar151 = local_1248;
      uVar153 = local_1250;
      uVar155 = local_1240;
      fVar363 = local_10c8;
      fVar305 = fStack_10c4;
      fVar239 = fStack_10c0;
      fVar323 = fStack_10bc;
      fVar169 = local_11a8;
      fVar288 = fStack_11a4;
      fVar289 = fStack_11a0;
      fVar293 = fStack_119c;
      fVar287 = local_10a8;
      fVar216 = fStack_10a4;
      fVar240 = fStack_10a0;
      fVar360 = fStack_109c;
      fVar168 = local_10b8;
      fVar327 = fStack_10b4;
      fVar330 = fStack_10b0;
      fVar331 = fStack_10ac;
      fVar326 = local_11b8;
      fVar294 = fStack_11b4;
      fVar295 = fStack_11b0;
      fVar296 = fStack_11ac;
      fVar334 = local_11c8;
      fVar297 = fStack_11c4;
      fVar307 = fStack_11c0;
      fVar308 = fStack_11bc;
      fVar361 = local_11d8;
      fVar310 = fStack_11d4;
      fVar311 = fStack_11d0;
      fVar313 = fStack_11cc;
    }
    uVar144 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar222._4_4_ = uVar144;
    auVar222._0_4_ = uVar144;
    auVar222._8_4_ = uVar144;
    auVar222._12_4_ = uVar144;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }